

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_avx512::forward
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined4 uVar5;
  float fVar6;
  uint uVar7;
  int *piVar8;
  void *pvVar9;
  undefined4 *puVar10;
  uint *puVar11;
  void *pvVar12;
  float *pfVar13;
  bool bVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  byte bVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float afVar81 [16];
  float afVar82 [16];
  float afVar83 [16];
  float afVar84 [16];
  float afVar85 [16];
  float afVar86 [16];
  float afVar87 [16];
  float afVar88 [16];
  float afVar89 [16];
  float afVar90 [16];
  float afVar91 [16];
  float afVar92 [16];
  int iVar93;
  int iVar94;
  undefined1 (*pauVar95) [32];
  ulong uVar96;
  ulong uVar97;
  long lVar98;
  undefined1 (*pauVar99) [32];
  void *pvVar100;
  undefined1 (*pauVar101) [32];
  undefined1 (*pauVar102) [64];
  uint uVar103;
  long lVar104;
  uint uVar105;
  long lVar106;
  uint uVar107;
  uint uVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  uint uVar112;
  long lVar113;
  long lVar114;
  ushort uVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [28];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  float fVar186;
  float fVar187;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  v4sf one_4;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar202 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar209 [64];
  float fVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar217 [16];
  undefined1 auVar221 [32];
  undefined1 auVar220 [16];
  undefined1 auVar222 [64];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  v4sf one;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar230 [16];
  undefined1 auVar233 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [64];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [64];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [64];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar261 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar262 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar263 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar264 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar265 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM29 [64];
  undefined1 in_ZMM30 [64];
  Option opt_flatten;
  undefined4 in_stack_fffffffffffffe9c;
  uint local_140;
  undefined1 (*local_128) [32];
  int *piStack_120;
  size_t local_118;
  int local_110;
  Allocator *local_108;
  int local_100;
  int local_fc;
  undefined8 local_f8;
  int local_f0;
  size_t local_e8;
  ulong local_d8;
  InnerProduct_x86_avx512 *local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  
  auVar117 = in_ZMM30._0_16_;
  auVar116 = in_ZMM29._0_16_;
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).int8_scale_term != 0)) {
    iVar93 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar93;
  }
  iVar93 = cpu_support_x86_f16c();
  if ((iVar93 != 0) && (opt->use_fp16_storage == true)) {
    iVar93 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar93;
  }
  local_100 = bottom_blob->dims;
  if (local_100 == 2) {
    iVar93 = (this->super_InnerProduct).num_output;
    local_fc = bottom_blob->w;
    if (local_fc == (this->super_InnerProduct).weight_data_size / iVar93) {
      Mat::create(top_blob,iVar93,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                  opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      innerproduct_gemm_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_InnerProduct).bias_data.data,
                 (this->super_InnerProduct).activation_type,
                 &(this->super_InnerProduct).activation_params,
                 (Option *)CONCAT44(in_stack_fffffffffffffe9c,(uint)opt->use_packing_layout));
      return 0;
    }
  }
  else {
    local_fc = bottom_blob->w;
  }
  piVar8 = bottom_blob->refcount;
  local_128 = (undefined1 (*) [32])bottom_blob->data;
  piStack_120 = bottom_blob->refcount;
  local_118 = bottom_blob->elemsize;
  local_110 = bottom_blob->elempack;
  local_108 = bottom_blob->allocator;
  local_f8._0_4_ = bottom_blob->h;
  local_f8._4_4_ = bottom_blob->d;
  local_f0 = bottom_blob->c;
  local_e8 = bottom_blob->cstep;
  iVar93 = local_100;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + 1;
    UNLOCK();
    iVar93 = bottom_blob->dims;
  }
  if (iVar93 != 1) {
    auStack_68 = SUB6448(*opt,0x10);
    local_78 = SUB648(*opt,0);
    pAStack_70 = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_128);
    if ((local_128 == (undefined1 (*) [32])0x0) || ((long)local_f0 * local_e8 == 0)) {
      iVar93 = -100;
      goto LAB_002b8f8b;
    }
  }
  uVar7 = (this->super_InnerProduct).num_output;
  uVar96 = 1;
  if (opt->use_packing_layout == true) {
    if ((uVar7 & 0xf) == 0) {
      uVar96 = 0x10;
    }
    else if ((uVar7 & 7) == 0) {
      uVar96 = 8;
    }
    else {
      uVar96 = (ulong)((uint)((uVar7 & 3) == 0) * 3 + 1);
    }
  }
  Mat::create(top_blob,(int)uVar7 / (int)uVar96,uVar96 * (local_118 / (ulong)(long)local_110),
              (int)uVar96,opt->blob_allocator);
  pauVar101 = local_128;
  afVar92 = _ps512_cephes_log_q2;
  afVar91 = _ps512_cephes_log_q1;
  afVar90 = ::_ps512_cephes_exp_p5;
  afVar89 = ::_ps512_cephes_exp_p4;
  afVar88 = ::_ps512_cephes_exp_p3;
  afVar87 = ::_ps512_cephes_exp_p2;
  afVar86 = ::_ps512_cephes_exp_p1;
  afVar85 = ::_ps512_cephes_exp_p0;
  afVar84 = ::_ps512_cephes_LOG2EF;
  afVar83 = ::_ps512_exp_lo;
  afVar82 = ::_ps512_exp_hi;
  afVar81 = ::_ps512_1;
  iVar93 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_002b8f8b;
  uVar7 = (this->super_InnerProduct).activation_type;
  pvVar9 = (this->super_InnerProduct).bias_data.data;
  uVar112 = local_110 * local_fc;
  iVar94 = top_blob->elempack;
  uVar103 = top_blob->w;
  uVar96 = (ulong)uVar103;
  iVar93 = 0;
  if (iVar94 < 8) {
    if (iVar94 == 1) {
      local_d8 = (ulong)(int)uVar103;
      lVar104 = (long)(int)uVar112;
      if (0 < (int)uVar103 >> 3) {
        local_88 = (ulong)(uint)((int)uVar103 >> 3);
        lVar98 = lVar104 * 0x1c;
        local_90 = lVar104 * 0x20;
        lVar114 = lVar104 * 8;
        local_b8 = lVar104 * 4;
        local_c0 = lVar104 * 0xc;
        local_c8 = 0;
        auVar143 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar144 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar216._8_4_ = 0x3f000000;
        auVar216._0_8_ = 0x3f0000003f000000;
        auVar216._12_4_ = 0x3f000000;
        auVar216._16_4_ = 0x3f000000;
        auVar216._20_4_ = 0x3f000000;
        auVar216._24_4_ = 0x3f000000;
        auVar216._28_4_ = 0x3f000000;
        auVar145 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar226._8_4_ = 0x3f800000;
        auVar226._0_8_ = 0x3f8000003f800000;
        auVar226._12_4_ = 0x3f800000;
        auVar226._16_4_ = 0x3f800000;
        auVar226._20_4_ = 0x3f800000;
        auVar226._24_4_ = 0x3f800000;
        auVar226._28_4_ = 0x3f800000;
        auVar229._8_4_ = 0x3f318000;
        auVar229._0_8_ = 0x3f3180003f318000;
        auVar229._12_4_ = 0x3f318000;
        auVar229._16_4_ = 0x3f318000;
        auVar229._20_4_ = 0x3f318000;
        auVar229._24_4_ = 0x3f318000;
        auVar229._28_4_ = 0x3f318000;
        auVar237._8_4_ = 0x39506967;
        auVar237._0_8_ = 0x3950696739506967;
        auVar237._12_4_ = 0x39506967;
        auVar237._16_4_ = 0x39506967;
        auVar237._20_4_ = 0x39506967;
        auVar237._24_4_ = 0x39506967;
        auVar237._28_4_ = 0x39506967;
        auVar146 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar147 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar148 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar251._8_4_ = 0x3e2aaaaa;
        auVar251._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar251._12_4_ = 0x3e2aaaaa;
        auVar251._16_4_ = 0x3e2aaaaa;
        auVar251._20_4_ = 0x3e2aaaaa;
        auVar251._24_4_ = 0x3e2aaaaa;
        auVar251._28_4_ = 0x3e2aaaaa;
        auVar255._8_4_ = 0x3f800000;
        auVar255._0_8_ = 0x3f8000003f800000;
        auVar255._12_4_ = 0x3f800000;
        auVar255._16_4_ = 0x3f800000;
        auVar255._20_4_ = 0x3f800000;
        auVar255._24_4_ = 0x3f800000;
        auVar255._28_4_ = 0x3f800000;
        auVar257._8_4_ = 0xb95e8083;
        auVar257._0_8_ = 0xb95e8083b95e8083;
        auVar257._12_4_ = 0xb95e8083;
        auVar257._16_4_ = 0xb95e8083;
        auVar257._20_4_ = 0xb95e8083;
        auVar257._24_4_ = 0xb95e8083;
        auVar257._28_4_ = 0xb95e8083;
        auVar149 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar150 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar151 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar152 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar153 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar154 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar116 = vxorps_avx512vl(auVar117,auVar117);
        auVar155 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        lVar109 = lVar104 * 0x18;
        lVar111 = lVar104 * 0x14;
        lVar106 = lVar104 << 4;
        uVar96 = 0;
        do {
          local_b0 = uVar96;
          local_a8 = lVar106;
          local_a0 = lVar111;
          local_98 = lVar109;
          uVar96 = local_b0 * 8;
          auVar239 = ZEXT1664(ZEXT816(0) << 0x40);
          if (pvVar9 != (void *)0x0) {
            auVar239 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar9 + local_b0 * 0x20));
          }
          auVar164 = auVar239._0_32_;
          pvVar100 = (this->weight_data_tm).data;
          if ((int)uVar112 < 8) {
            uVar105 = 0;
            lVar109 = uVar96 * lVar104 * 4;
            lVar111 = (uVar96 | 1) * lVar104 * 4;
            lVar106 = (uVar96 | 2) * lVar104 * 4;
            lVar110 = (uVar96 | 3) * lVar104 * 4;
            lVar1 = (uVar96 | 4) * lVar104 * 4;
            lVar2 = (uVar96 | 5) * lVar104 * 4;
            lVar3 = (uVar96 | 6) * lVar104 * 4;
            lVar4 = (uVar96 | 7) * lVar104 * 4;
            auVar163 = SUB6432(ZEXT864(0),0);
            auVar162 = ZEXT832(0);
            auVar161 = ZEXT832(0);
            auVar160 = SUB6432(ZEXT864(0),0);
            auVar159 = ZEXT832(0);
            auVar158 = SUB6432(ZEXT864(0),0);
            auVar157 = ZEXT832(0);
            auVar156 = SUB6432(ZEXT864(0),0);
            pauVar95 = local_128;
          }
          else {
            auVar260 = ZEXT864(0);
            iVar93 = 7;
            auVar248 = ZEXT864(0);
            auVar245 = ZEXT864(0);
            auVar222 = ZEXT864(0);
            auVar242 = ZEXT864(0);
            auVar209 = ZEXT864(0);
            auVar261 = ZEXT864(0);
            auVar233 = ZEXT864(0);
            lVar109 = 0;
            do {
              lVar113 = lVar109;
              auVar163 = *(undefined1 (*) [32])(*local_128 + lVar113);
              auVar156 = vfmadd231ps_avx512vl
                                   (auVar260._0_32_,auVar163,
                                    *(undefined1 (*) [32])((long)pvVar100 + lVar113 + local_c8));
              auVar260 = ZEXT3264(auVar156);
              auVar157 = vfmadd231ps_avx512vl
                                   (auVar248._0_32_,auVar163,
                                    *(undefined1 (*) [32])((long)pvVar100 + lVar113 + local_b8));
              auVar248 = ZEXT3264(auVar157);
              auVar158 = vfmadd231ps_avx512vl
                                   (auVar245._0_32_,auVar163,
                                    *(undefined1 (*) [32])((long)pvVar100 + lVar113 + lVar114));
              auVar245 = ZEXT3264(auVar158);
              auVar159 = vfmadd231ps_avx512vl
                                   (auVar222._0_32_,auVar163,
                                    *(undefined1 (*) [32])((long)pvVar100 + lVar113 + local_c0));
              auVar222 = ZEXT3264(auVar159);
              auVar160 = vfmadd231ps_avx512vl
                                   (auVar242._0_32_,auVar163,
                                    *(undefined1 (*) [32])((long)pvVar100 + lVar113 + local_a8));
              auVar242 = ZEXT3264(auVar160);
              auVar161 = vfmadd231ps_avx512vl
                                   (auVar209._0_32_,auVar163,
                                    *(undefined1 (*) [32])((long)pvVar100 + lVar113 + local_a0));
              auVar209 = ZEXT3264(auVar161);
              auVar162 = vfmadd231ps_avx512vl
                                   (auVar261._0_32_,auVar163,
                                    *(undefined1 (*) [32])((long)pvVar100 + lVar113 + local_98));
              auVar261 = ZEXT3264(auVar162);
              auVar163 = vfmadd231ps_avx512vl
                                   (auVar233._0_32_,auVar163,
                                    *(undefined1 (*) [32])((long)pvVar100 + lVar113 + lVar98));
              auVar233 = ZEXT3264(auVar163);
              iVar93 = iVar93 + 8;
              lVar109 = lVar113 + 0x20;
            } while (iVar93 < (int)uVar112);
            lVar4 = lVar109 + lVar98;
            lVar3 = lVar109 + local_98;
            lVar2 = lVar109 + local_a0;
            lVar1 = lVar109 + local_a8;
            lVar110 = lVar109 + local_c0;
            lVar106 = lVar109 + lVar114;
            lVar111 = lVar109 + local_b8;
            lVar109 = lVar109 + local_c8;
            pauVar95 = (undefined1 (*) [32])(local_128[1] + lVar113);
            uVar105 = uVar112 & 0xfffffff8;
          }
          if (uVar112 - uVar105 != 0 && (int)uVar105 <= (int)uVar112) {
            lVar113 = 0;
            do {
              auVar117 = vinsertps_avx512f(ZEXT416(*(uint *)((long)pvVar100 + lVar113 * 4 + lVar1)),
                                           ZEXT416(*(uint *)((long)pvVar100 + lVar113 * 4 + lVar2)),
                                           0x10);
              auVar117 = vinsertps_avx512f(auVar117,ZEXT416(*(uint *)((long)pvVar100 +
                                                                     lVar113 * 4 + lVar3)),0x20);
              auVar117 = vinsertps_avx512f(auVar117,ZEXT416(*(uint *)((long)pvVar100 +
                                                                     lVar113 * 4 + lVar4)),0x30);
              auVar118 = vinsertps_avx512f(ZEXT416(*(uint *)((long)pvVar100 + lVar113 * 4 + lVar109)
                                                  ),ZEXT416(*(uint *)((long)pvVar100 +
                                                                     lVar113 * 4 + lVar111)),0x10);
              auVar118 = vinsertps_avx512f(auVar118,ZEXT416(*(uint *)((long)pvVar100 +
                                                                     lVar113 * 4 + lVar106)),0x20);
              auVar118 = vinsertps_avx512f(auVar118,ZEXT416(*(uint *)((long)pvVar100 +
                                                                     lVar113 * 4 + lVar110)),0x30);
              auVar164 = vinsertf32x4_avx512vl(ZEXT1632(auVar118),auVar117,1);
              uVar5 = *(undefined4 *)(*pauVar95 + lVar113 * 4);
              auVar51._4_4_ = uVar5;
              auVar51._0_4_ = uVar5;
              auVar51._8_4_ = uVar5;
              auVar51._12_4_ = uVar5;
              auVar51._16_4_ = uVar5;
              auVar51._20_4_ = uVar5;
              auVar51._24_4_ = uVar5;
              auVar51._28_4_ = uVar5;
              auVar164 = vfmadd231ps_avx512vl(auVar239._0_32_,auVar164,auVar51);
              auVar239 = ZEXT3264(auVar164);
              lVar113 = lVar113 + 1;
            } while (uVar112 - uVar105 != (int)lVar113);
          }
          auVar156 = vhaddps_avx(auVar156,auVar157);
          auVar157 = vhaddps_avx(auVar158,auVar159);
          auVar157 = vhaddps_avx(auVar156,auVar157);
          auVar156 = vhaddps_avx(auVar160,auVar161);
          auVar158 = vhaddps_avx(auVar162,auVar163);
          auVar158 = vhaddps_avx(auVar156,auVar158);
          auVar156 = vblendps_avx(auVar157,auVar158,0xf0);
          auVar157 = vperm2f128_avx(auVar157,auVar158,0x21);
          auVar170._0_4_ = auVar157._0_4_ + auVar156._0_4_ + auVar164._0_4_;
          auVar170._4_4_ = auVar157._4_4_ + auVar156._4_4_ + auVar164._4_4_;
          auVar170._8_4_ = auVar157._8_4_ + auVar156._8_4_ + auVar164._8_4_;
          auVar170._12_4_ = auVar157._12_4_ + auVar156._12_4_ + auVar164._12_4_;
          auVar170._16_4_ = auVar157._16_4_ + auVar156._16_4_ + auVar164._16_4_;
          auVar170._20_4_ = auVar157._20_4_ + auVar156._20_4_ + auVar164._20_4_;
          auVar170._24_4_ = auVar157._24_4_ + auVar156._24_4_ + auVar164._24_4_;
          auVar170._28_4_ = auVar157._28_4_ + auVar156._28_4_ + auVar164._28_4_;
          if (5 < uVar7 - 1) goto LAB_002b80a4;
          auVar164 = ZEXT1632(auVar116);
          switch(uVar7) {
          case 1:
            auVar170 = vmaxps_avx512vl(auVar170,ZEXT1632(auVar116));
            break;
          case 2:
            auVar156 = vmaxps_avx512vl(auVar170,auVar164);
            auVar164 = vminps_avx512vl(auVar170,auVar164);
            uVar5 = *(this->super_InnerProduct).activation_params.data;
            auVar65._4_4_ = uVar5;
            auVar65._0_4_ = uVar5;
            auVar65._8_4_ = uVar5;
            auVar65._12_4_ = uVar5;
            auVar65._16_4_ = uVar5;
            auVar65._20_4_ = uVar5;
            auVar65._24_4_ = uVar5;
            auVar65._28_4_ = uVar5;
            auVar170 = vfmadd132ps_avx512vl(auVar164,auVar156,auVar65);
            break;
          case 3:
            puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar5 = *puVar10;
            auVar63._4_4_ = uVar5;
            auVar63._0_4_ = uVar5;
            auVar63._8_4_ = uVar5;
            auVar63._12_4_ = uVar5;
            auVar63._16_4_ = uVar5;
            auVar63._20_4_ = uVar5;
            auVar63._24_4_ = uVar5;
            auVar63._28_4_ = uVar5;
            auVar164 = vmaxps_avx512vl(auVar170,auVar63);
            uVar5 = puVar10[1];
            auVar64._4_4_ = uVar5;
            auVar64._0_4_ = uVar5;
            auVar64._8_4_ = uVar5;
            auVar64._12_4_ = uVar5;
            auVar64._16_4_ = uVar5;
            auVar64._20_4_ = uVar5;
            auVar64._24_4_ = uVar5;
            auVar64._28_4_ = uVar5;
            auVar170 = vminps_avx512vl(auVar164,auVar64);
            break;
          case 4:
            auVar61._8_4_ = 0x80000000;
            auVar61._0_8_ = 0x8000000080000000;
            auVar61._12_4_ = 0x80000000;
            auVar61._16_4_ = 0x80000000;
            auVar61._20_4_ = 0x80000000;
            auVar61._24_4_ = 0x80000000;
            auVar61._28_4_ = 0x80000000;
            auVar164 = vxorps_avx512vl(auVar170,auVar61);
            auVar164 = vminps_avx512vl(auVar164,auVar143);
            auVar156 = vmaxps_avx512vl(auVar164,auVar144);
            auVar157 = vfmadd231ps_avx512vl(auVar216,auVar156,auVar145);
            auVar164 = vroundps_avx(auVar157,1);
            uVar96 = vcmpps_avx512vl(auVar157,auVar164,1);
            auVar158 = vsubps_avx512vl(auVar164,auVar226);
            bVar14 = (bool)((byte)uVar96 & 1);
            auVar171._0_4_ = (float)((uint)bVar14 * auVar158._0_4_ | (uint)!bVar14 * auVar164._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
            auVar171._4_4_ = (float)((uint)bVar14 * auVar158._4_4_ | (uint)!bVar14 * auVar164._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
            auVar171._8_4_ = (float)((uint)bVar14 * auVar158._8_4_ | (uint)!bVar14 * auVar164._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar96 >> 3) & 1);
            auVar171._12_4_ =
                 (float)((uint)bVar14 * auVar158._12_4_ | (uint)!bVar14 * auVar164._12_4_);
            bVar14 = (bool)((byte)(uVar96 >> 4) & 1);
            auVar171._16_4_ =
                 (float)((uint)bVar14 * auVar158._16_4_ | (uint)!bVar14 * auVar164._16_4_);
            bVar14 = (bool)((byte)(uVar96 >> 5) & 1);
            auVar171._20_4_ =
                 (float)((uint)bVar14 * auVar158._20_4_ | (uint)!bVar14 * auVar164._20_4_);
            bVar14 = (bool)((byte)(uVar96 >> 6) & 1);
            auVar171._24_4_ =
                 (float)((uint)bVar14 * auVar158._24_4_ | (uint)!bVar14 * auVar164._24_4_);
            bVar14 = SUB81(uVar96 >> 7,0);
            auVar171._28_4_ =
                 (float)((uint)bVar14 * auVar158._28_4_ | (uint)!bVar14 * auVar164._28_4_);
            auVar117 = vfmsub231ps_fma(auVar156,auVar171,auVar229);
            auVar62._8_4_ = 0x395e8083;
            auVar62._0_8_ = 0x395e8083395e8083;
            auVar62._12_4_ = 0x395e8083;
            auVar62._16_4_ = 0x395e8083;
            auVar62._20_4_ = 0x395e8083;
            auVar62._24_4_ = 0x395e8083;
            auVar62._28_4_ = 0x395e8083;
            auVar164 = vfmsub231ps_avx512vl(ZEXT1632(auVar117),auVar171,auVar62);
            auVar77._4_4_ = auVar164._4_4_ * auVar164._4_4_;
            auVar77._0_4_ = auVar164._0_4_ * auVar164._0_4_;
            auVar77._8_4_ = auVar164._8_4_ * auVar164._8_4_;
            auVar77._12_4_ = auVar164._12_4_ * auVar164._12_4_;
            auVar77._16_4_ = auVar164._16_4_ * auVar164._16_4_;
            auVar77._20_4_ = auVar164._20_4_ * auVar164._20_4_;
            auVar77._24_4_ = auVar164._24_4_ * auVar164._24_4_;
            auVar77._28_4_ = auVar157._28_4_;
            auVar156 = vfmadd213ps_avx512vl(auVar237,auVar164,auVar146);
            auVar156 = vfmadd213ps_avx512vl(auVar156,auVar164,auVar147);
            auVar156 = vfmadd213ps_avx512vl(auVar156,auVar164,auVar148);
            auVar117 = vfmadd213ps_fma(auVar156,auVar164,auVar251);
            auVar117 = vfmadd213ps_fma(ZEXT1632(auVar117),auVar164,auVar216);
            auVar117 = vfmadd213ps_fma(ZEXT1632(auVar117),auVar77,auVar164);
            auVar191._0_4_ = auVar117._0_4_ + 1.0;
            auVar191._4_4_ = auVar117._4_4_ + 1.0;
            auVar191._8_4_ = auVar117._8_4_ + 1.0;
            auVar191._12_4_ = auVar117._12_4_ + 1.0;
            auVar191._16_4_ = 0x3f800000;
            auVar191._20_4_ = 0x3f800000;
            auVar191._24_4_ = 0x3f800000;
            auVar191._28_4_ = 0x3f800000;
            auVar200._0_4_ = (int)auVar171._0_4_;
            auVar200._4_4_ = (int)auVar171._4_4_;
            auVar200._8_4_ = (int)auVar171._8_4_;
            auVar200._12_4_ = (int)auVar171._12_4_;
            auVar200._16_4_ = (int)auVar171._16_4_;
            auVar200._20_4_ = (int)auVar171._20_4_;
            auVar200._24_4_ = (int)auVar171._24_4_;
            auVar200._28_4_ = (int)auVar171._28_4_;
            auVar164 = vpslld_avx2(auVar200,0x17);
            auVar164 = vpaddd_avx2(auVar255,auVar164);
            auVar117 = vfmadd213ps_fma(auVar164,auVar191,auVar226);
            auVar170 = vdivps_avx(auVar226,ZEXT1632(auVar117));
            break;
          case 5:
            auVar156 = vminps_avx512vl(auVar170,auVar143);
            auVar157 = vmaxps_avx512vl(auVar156,auVar144);
            auVar117 = vfmadd213ps_fma(auVar145,auVar157,auVar216);
            auVar156 = vroundps_avx(ZEXT1632(auVar117),1);
            uVar96 = vcmpps_avx512vl(ZEXT1632(auVar117),auVar156,1);
            auVar158 = vsubps_avx512vl(auVar156,auVar226);
            bVar14 = (bool)((byte)uVar96 & 1);
            auVar165._0_4_ = (float)((uint)bVar14 * auVar158._0_4_ | (uint)!bVar14 * auVar156._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
            auVar165._4_4_ = (float)((uint)bVar14 * auVar158._4_4_ | (uint)!bVar14 * auVar156._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
            auVar165._8_4_ = (float)((uint)bVar14 * auVar158._8_4_ | (uint)!bVar14 * auVar156._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar96 >> 3) & 1);
            auVar165._12_4_ =
                 (float)((uint)bVar14 * auVar158._12_4_ | (uint)!bVar14 * auVar156._12_4_);
            bVar14 = (bool)((byte)(uVar96 >> 4) & 1);
            auVar165._16_4_ =
                 (float)((uint)bVar14 * auVar158._16_4_ | (uint)!bVar14 * auVar156._16_4_);
            bVar14 = (bool)((byte)(uVar96 >> 5) & 1);
            auVar165._20_4_ =
                 (float)((uint)bVar14 * auVar158._20_4_ | (uint)!bVar14 * auVar156._20_4_);
            bVar14 = (bool)((byte)(uVar96 >> 6) & 1);
            auVar165._24_4_ =
                 (float)((uint)bVar14 * auVar158._24_4_ | (uint)!bVar14 * auVar156._24_4_);
            bVar14 = SUB81(uVar96 >> 7,0);
            auVar165._28_4_ =
                 (float)((uint)bVar14 * auVar158._28_4_ | (uint)!bVar14 * auVar156._28_4_);
            auVar117 = vfmsub231ps_fma(auVar157,auVar165,auVar229);
            auVar118 = vfnmsub231ps_fma(ZEXT1632(auVar117),auVar165,auVar257);
            auVar157 = ZEXT1632(auVar118);
            auVar156 = vfmadd213ps_avx512vl(auVar237,auVar157,auVar146);
            auVar156 = vfmadd213ps_avx512vl(auVar156,auVar157,auVar147);
            auVar156 = vfmadd213ps_avx512vl(auVar156,auVar157,auVar148);
            auVar157 = ZEXT1632(auVar118);
            auVar117 = vfmadd213ps_fma(auVar156,auVar157,auVar251);
            auVar117 = vfmadd213ps_fma(ZEXT1632(auVar117),auVar157,auVar216);
            auVar117 = vfmadd213ps_fma(ZEXT1632(auVar117),
                                       ZEXT1632(CONCAT412(auVar118._12_4_ * auVar118._12_4_,
                                                          CONCAT48(auVar118._8_4_ * auVar118._8_4_,
                                                                   CONCAT44(auVar118._4_4_ *
                                                                            auVar118._4_4_,
                                                                            auVar118._0_4_ *
                                                                            auVar118._0_4_)))),
                                       auVar157);
            auVar198._0_4_ = auVar117._0_4_ + 1.0;
            auVar198._4_4_ = auVar117._4_4_ + 1.0;
            auVar198._8_4_ = auVar117._8_4_ + 1.0;
            auVar198._12_4_ = auVar117._12_4_ + 1.0;
            auVar198._16_4_ = 0x3f800000;
            auVar198._20_4_ = 0x3f800000;
            auVar198._24_4_ = 0x3f800000;
            auVar198._28_4_ = 0x3f800000;
            auVar207._0_4_ = (int)auVar165._0_4_;
            auVar207._4_4_ = (int)auVar165._4_4_;
            auVar207._8_4_ = (int)auVar165._8_4_;
            auVar207._12_4_ = (int)auVar165._12_4_;
            auVar207._16_4_ = (int)auVar165._16_4_;
            auVar207._20_4_ = (int)auVar165._20_4_;
            auVar207._24_4_ = (int)auVar165._24_4_;
            auVar207._28_4_ = (int)auVar165._28_4_;
            auVar156 = vpslld_avx2(auVar207,0x17);
            auVar156 = vpaddd_avx2(auVar255,auVar156);
            auVar117 = vfmadd213ps_fma(auVar156,auVar198,auVar226);
            uVar96 = vcmpps_avx512vl(ZEXT1632(auVar117),auVar164,2);
            auVar53._8_4_ = 0x800000;
            auVar53._0_8_ = 0x80000000800000;
            auVar53._12_4_ = 0x800000;
            auVar53._16_4_ = 0x800000;
            auVar53._20_4_ = 0x800000;
            auVar53._24_4_ = 0x800000;
            auVar53._28_4_ = 0x800000;
            auVar164 = vmaxps_avx512vl(ZEXT1632(auVar117),auVar53);
            auVar158 = vpsrld_avx2(auVar164,0x17);
            auVar221._8_4_ = 0x807fffff;
            auVar221._0_8_ = 0x807fffff807fffff;
            auVar221._12_4_ = 0x807fffff;
            auVar221._16_4_ = 0x807fffff;
            auVar221._20_4_ = 0x807fffff;
            auVar221._24_4_ = 0x807fffff;
            auVar221._28_4_ = 0x807fffff;
            auVar54._8_4_ = 0x3f000000;
            auVar54._0_8_ = 0x3f0000003f000000;
            auVar54._12_4_ = 0x3f000000;
            auVar54._16_4_ = 0x3f000000;
            auVar54._20_4_ = 0x3f000000;
            auVar54._24_4_ = 0x3f000000;
            auVar54._28_4_ = 0x3f000000;
            auVar164 = vpternlogd_avx512vl(auVar164,auVar221,auVar54,0xea);
            auVar55._8_4_ = 0x3f3504f3;
            auVar55._0_8_ = 0x3f3504f33f3504f3;
            auVar55._12_4_ = 0x3f3504f3;
            auVar55._16_4_ = 0x3f3504f3;
            auVar55._20_4_ = 0x3f3504f3;
            auVar55._24_4_ = 0x3f3504f3;
            auVar55._28_4_ = 0x3f3504f3;
            uVar97 = vcmpps_avx512vl(auVar164,auVar55,1);
            auVar156 = vaddps_avx512vl(auVar164,auVar149);
            auVar157 = vaddps_avx512vl(auVar156,auVar164);
            bVar14 = (bool)((byte)uVar97 & 1);
            auVar166._0_4_ = (float)((uint)bVar14 * auVar157._0_4_ | (uint)!bVar14 * auVar156._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar166._4_4_ = (float)((uint)bVar14 * auVar157._4_4_ | (uint)!bVar14 * auVar156._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar166._8_4_ = (float)((uint)bVar14 * auVar157._8_4_ | (uint)!bVar14 * auVar156._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar166._12_4_ =
                 (float)((uint)bVar14 * auVar157._12_4_ | (uint)!bVar14 * auVar156._12_4_);
            bVar14 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar166._16_4_ =
                 (float)((uint)bVar14 * auVar157._16_4_ | (uint)!bVar14 * auVar156._16_4_);
            bVar14 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar166._20_4_ =
                 (float)((uint)bVar14 * auVar157._20_4_ | (uint)!bVar14 * auVar156._20_4_);
            bVar14 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar166._24_4_ =
                 (float)((uint)bVar14 * auVar157._24_4_ | (uint)!bVar14 * auVar156._24_4_);
            bVar14 = SUB81(uVar97 >> 7,0);
            auVar166._28_4_ = (uint)bVar14 * auVar157._28_4_ | (uint)!bVar14 * auVar156._28_4_;
            auVar75._4_4_ = auVar166._4_4_ * auVar166._4_4_;
            auVar75._0_4_ = auVar166._0_4_ * auVar166._0_4_;
            auVar75._8_4_ = auVar166._8_4_ * auVar166._8_4_;
            auVar75._12_4_ = auVar166._12_4_ * auVar166._12_4_;
            auVar75._16_4_ = auVar166._16_4_ * auVar166._16_4_;
            auVar75._20_4_ = auVar166._20_4_ * auVar166._20_4_;
            auVar75._24_4_ = auVar166._24_4_ * auVar166._24_4_;
            auVar75._28_4_ = auVar164._28_4_;
            auVar56._8_4_ = 0xbdebd1b8;
            auVar56._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar56._12_4_ = 0xbdebd1b8;
            auVar56._16_4_ = 0xbdebd1b8;
            auVar56._20_4_ = 0xbdebd1b8;
            auVar56._24_4_ = 0xbdebd1b8;
            auVar56._28_4_ = 0xbdebd1b8;
            auVar164 = vfmadd213ps_avx512vl(auVar150,auVar166,auVar56);
            auVar57._8_4_ = 0x3def251a;
            auVar57._0_8_ = 0x3def251a3def251a;
            auVar57._12_4_ = 0x3def251a;
            auVar57._16_4_ = 0x3def251a;
            auVar57._20_4_ = 0x3def251a;
            auVar57._24_4_ = 0x3def251a;
            auVar57._28_4_ = 0x3def251a;
            auVar164 = vfmadd213ps_avx512vl(auVar164,auVar166,auVar57);
            auVar58._8_4_ = 0xbdfe5d4f;
            auVar58._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar58._12_4_ = 0xbdfe5d4f;
            auVar58._16_4_ = 0xbdfe5d4f;
            auVar58._20_4_ = 0xbdfe5d4f;
            auVar58._24_4_ = 0xbdfe5d4f;
            auVar58._28_4_ = 0xbdfe5d4f;
            auVar164 = vfmadd213ps_avx512vl(auVar164,auVar166,auVar58);
            auVar59._8_4_ = 0x3e11e9bf;
            auVar59._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar59._12_4_ = 0x3e11e9bf;
            auVar59._16_4_ = 0x3e11e9bf;
            auVar59._20_4_ = 0x3e11e9bf;
            auVar59._24_4_ = 0x3e11e9bf;
            auVar59._28_4_ = 0x3e11e9bf;
            auVar164 = vfmadd213ps_avx512vl(auVar164,auVar166,auVar59);
            auVar164 = vfmadd213ps_avx512vl(auVar164,auVar166,auVar151);
            auVar164 = vfmadd213ps_avx512vl(auVar164,auVar166,auVar152);
            auVar164 = vfmadd213ps_avx512vl(auVar164,auVar166,auVar153);
            auVar164 = vfmadd213ps_avx512vl(auVar164,auVar166,auVar154);
            auVar76._4_4_ = auVar166._4_4_ * auVar166._4_4_ * auVar166._4_4_ * auVar164._4_4_;
            auVar76._0_4_ = auVar166._0_4_ * auVar166._0_4_ * auVar166._0_4_ * auVar164._0_4_;
            auVar76._8_4_ = auVar166._8_4_ * auVar166._8_4_ * auVar166._8_4_ * auVar164._8_4_;
            auVar76._12_4_ = auVar166._12_4_ * auVar166._12_4_ * auVar166._12_4_ * auVar164._12_4_;
            auVar76._16_4_ = auVar166._16_4_ * auVar166._16_4_ * auVar166._16_4_ * auVar164._16_4_;
            auVar76._20_4_ = auVar166._20_4_ * auVar166._20_4_ * auVar166._20_4_ * auVar164._20_4_;
            auVar76._24_4_ = auVar166._24_4_ * auVar166._24_4_ * auVar166._24_4_ * auVar164._24_4_;
            auVar76._28_4_ = auVar164._28_4_;
            auVar60._8_4_ = 0xffffff82;
            auVar60._0_8_ = 0xffffff82ffffff82;
            auVar60._12_4_ = 0xffffff82;
            auVar60._16_4_ = 0xffffff82;
            auVar60._20_4_ = 0xffffff82;
            auVar60._24_4_ = 0xffffff82;
            auVar60._28_4_ = 0xffffff82;
            auVar164 = vpaddd_avx512vl(auVar158,auVar60);
            auVar164 = vcvtdq2ps_avx(auVar164);
            auVar156 = vsubps_avx512vl(auVar164,auVar226);
            bVar14 = (bool)((byte)uVar97 & 1);
            auVar167._0_4_ = (uint)bVar14 * auVar156._0_4_ | (uint)!bVar14 * auVar164._0_4_;
            bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
            auVar167._4_4_ = (uint)bVar14 * auVar156._4_4_ | (uint)!bVar14 * auVar164._4_4_;
            bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
            auVar167._8_4_ = (uint)bVar14 * auVar156._8_4_ | (uint)!bVar14 * auVar164._8_4_;
            bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
            auVar167._12_4_ = (uint)bVar14 * auVar156._12_4_ | (uint)!bVar14 * auVar164._12_4_;
            bVar14 = (bool)((byte)(uVar97 >> 4) & 1);
            auVar167._16_4_ = (uint)bVar14 * auVar156._16_4_ | (uint)!bVar14 * auVar164._16_4_;
            bVar14 = (bool)((byte)(uVar97 >> 5) & 1);
            auVar167._20_4_ = (uint)bVar14 * auVar156._20_4_ | (uint)!bVar14 * auVar164._20_4_;
            bVar14 = (bool)((byte)(uVar97 >> 6) & 1);
            auVar167._24_4_ = (uint)bVar14 * auVar156._24_4_ | (uint)!bVar14 * auVar164._24_4_;
            bVar14 = SUB81(uVar97 >> 7,0);
            auVar167._28_4_ = (uint)bVar14 * auVar156._28_4_ | (uint)!bVar14 * auVar164._28_4_;
            auVar117 = vfmadd231ps_fma(auVar76,auVar167,auVar257);
            auVar117 = vfmsub231ps_fma(ZEXT1632(auVar117),auVar216,auVar75);
            auVar164 = vsubps_avx(ZEXT1632(auVar117),auVar166);
            auVar117 = vfmsub231ps_fma(auVar164,auVar229,auVar167);
            auVar164 = vmulps_avx512vl(ZEXT1632(auVar117),auVar155);
            auVar156 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar14 = (bool)((byte)uVar96 & 1);
            auVar168._0_4_ = (uint)bVar14 * auVar156._0_4_ | (uint)!bVar14 * auVar164._0_4_;
            bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
            auVar168._4_4_ = (uint)bVar14 * auVar156._4_4_ | (uint)!bVar14 * auVar164._4_4_;
            bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
            auVar168._8_4_ = (uint)bVar14 * auVar156._8_4_ | (uint)!bVar14 * auVar164._8_4_;
            bVar14 = (bool)((byte)(uVar96 >> 3) & 1);
            auVar168._12_4_ = (uint)bVar14 * auVar156._12_4_ | (uint)!bVar14 * auVar164._12_4_;
            bVar14 = (bool)((byte)(uVar96 >> 4) & 1);
            auVar168._16_4_ = (uint)bVar14 * auVar156._16_4_ | (uint)!bVar14 * auVar164._16_4_;
            bVar14 = (bool)((byte)(uVar96 >> 5) & 1);
            auVar168._20_4_ = (uint)bVar14 * auVar156._20_4_ | (uint)!bVar14 * auVar164._20_4_;
            bVar14 = (bool)((byte)(uVar96 >> 6) & 1);
            auVar168._24_4_ = (uint)bVar14 * auVar156._24_4_ | (uint)!bVar14 * auVar164._24_4_;
            bVar14 = SUB81(uVar96 >> 7,0);
            auVar168._28_4_ = (uint)bVar14 * auVar156._28_4_ | (uint)!bVar14 * auVar164._28_4_;
            auVar164 = vminps_avx512vl(auVar168,auVar143);
            auVar156 = vmaxps_avx512vl(auVar164,auVar144);
            auVar117 = vfmadd213ps_fma(auVar145,auVar156,auVar216);
            auVar164 = vroundps_avx(ZEXT1632(auVar117),1);
            uVar96 = vcmpps_avx512vl(ZEXT1632(auVar117),auVar164,1);
            auVar157 = vsubps_avx512vl(auVar164,auVar226);
            bVar14 = (bool)((byte)uVar96 & 1);
            auVar169._0_4_ = (float)((uint)bVar14 * auVar157._0_4_ | (uint)!bVar14 * auVar164._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
            auVar169._4_4_ = (float)((uint)bVar14 * auVar157._4_4_ | (uint)!bVar14 * auVar164._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
            auVar169._8_4_ = (float)((uint)bVar14 * auVar157._8_4_ | (uint)!bVar14 * auVar164._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar96 >> 3) & 1);
            auVar169._12_4_ =
                 (float)((uint)bVar14 * auVar157._12_4_ | (uint)!bVar14 * auVar164._12_4_);
            bVar14 = (bool)((byte)(uVar96 >> 4) & 1);
            auVar169._16_4_ =
                 (float)((uint)bVar14 * auVar157._16_4_ | (uint)!bVar14 * auVar164._16_4_);
            bVar14 = (bool)((byte)(uVar96 >> 5) & 1);
            auVar169._20_4_ =
                 (float)((uint)bVar14 * auVar157._20_4_ | (uint)!bVar14 * auVar164._20_4_);
            bVar14 = (bool)((byte)(uVar96 >> 6) & 1);
            auVar169._24_4_ =
                 (float)((uint)bVar14 * auVar157._24_4_ | (uint)!bVar14 * auVar164._24_4_);
            bVar14 = SUB81(uVar96 >> 7,0);
            auVar169._28_4_ =
                 (float)((uint)bVar14 * auVar157._28_4_ | (uint)!bVar14 * auVar164._28_4_);
            auVar117 = vfmsub231ps_fma(auVar156,auVar169,auVar229);
            auVar118 = vfnmsub231ps_fma(ZEXT1632(auVar117),auVar169,auVar257);
            auVar156 = ZEXT1632(auVar118);
            auVar164 = vfmadd213ps_avx512vl(auVar237,auVar156,auVar146);
            auVar164 = vfmadd213ps_avx512vl(auVar164,auVar156,auVar147);
            auVar164 = vfmadd213ps_avx512vl(auVar164,auVar156,auVar148);
            auVar156 = ZEXT1632(auVar118);
            auVar117 = vfmadd213ps_fma(auVar164,auVar156,auVar251);
            auVar117 = vfmadd213ps_fma(ZEXT1632(auVar117),auVar156,auVar216);
            auVar117 = vfmadd213ps_fma(ZEXT1632(auVar117),
                                       ZEXT1632(CONCAT412(auVar118._12_4_ * auVar118._12_4_,
                                                          CONCAT48(auVar118._8_4_ * auVar118._8_4_,
                                                                   CONCAT44(auVar118._4_4_ *
                                                                            auVar118._4_4_,
                                                                            auVar118._0_4_ *
                                                                            auVar118._0_4_)))),
                                       auVar156);
            auVar199._0_4_ = auVar117._0_4_ + 1.0;
            auVar199._4_4_ = auVar117._4_4_ + 1.0;
            auVar199._8_4_ = auVar117._8_4_ + 1.0;
            auVar199._12_4_ = auVar117._12_4_ + 1.0;
            auVar199._16_4_ = 0x3f800000;
            auVar199._20_4_ = 0x3f800000;
            auVar199._24_4_ = 0x3f800000;
            auVar199._28_4_ = 0x3f800000;
            auVar208._0_4_ = (int)auVar169._0_4_;
            auVar208._4_4_ = (int)auVar169._4_4_;
            auVar208._8_4_ = (int)auVar169._8_4_;
            auVar208._12_4_ = (int)auVar169._12_4_;
            auVar208._16_4_ = (int)auVar169._16_4_;
            auVar208._20_4_ = (int)auVar169._20_4_;
            auVar208._24_4_ = (int)auVar169._24_4_;
            auVar208._28_4_ = (int)auVar169._28_4_;
            auVar164 = vpslld_avx2(auVar208,0x17);
            auVar164 = vpaddd_avx2(auVar255,auVar164);
            auVar117 = vfmadd213ps_fma(auVar164,auVar199,auVar226);
            auVar164 = vdivps_avx(auVar226,ZEXT1632(auVar117));
            auVar164 = vfnmadd213ps_avx512vl(auVar164,auVar155,auVar149);
            auVar142 = auVar164._0_28_;
            goto LAB_002b8062;
          case 6:
            puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar5 = *puVar10;
            auVar201._4_4_ = uVar5;
            auVar201._0_4_ = uVar5;
            auVar201._8_4_ = uVar5;
            auVar201._12_4_ = uVar5;
            auVar201._16_4_ = uVar5;
            auVar201._20_4_ = uVar5;
            auVar201._24_4_ = uVar5;
            auVar201._28_4_ = uVar5;
            uVar5 = puVar10[1];
            auVar52._4_4_ = uVar5;
            auVar52._0_4_ = uVar5;
            auVar52._8_4_ = uVar5;
            auVar52._12_4_ = uVar5;
            auVar52._16_4_ = uVar5;
            auVar52._20_4_ = uVar5;
            auVar52._24_4_ = uVar5;
            auVar52._28_4_ = uVar5;
            auVar156 = vfmadd213ps_avx512vl(auVar201,auVar170,auVar52);
            auVar164 = vmaxps_avx512vl(auVar156,auVar164);
            auVar164 = vminps_avx(auVar164,auVar226);
            auVar142 = auVar164._0_28_;
LAB_002b8062:
            auVar170._4_4_ = auVar142._4_4_ * auVar170._4_4_;
            auVar170._0_4_ = auVar142._0_4_ * auVar170._0_4_;
            auVar170._8_4_ = auVar142._8_4_ * auVar170._8_4_;
            auVar170._12_4_ = auVar142._12_4_ * auVar170._12_4_;
            auVar170._16_4_ = auVar142._16_4_ * auVar170._16_4_;
            auVar170._20_4_ = auVar142._20_4_ * auVar170._20_4_;
            auVar170._24_4_ = auVar142._24_4_ * auVar170._24_4_;
          }
LAB_002b80a4:
          *(undefined1 (*) [32])((long)top_blob->data + local_b0 * 0x20) = auVar170;
          lVar98 = lVar98 + local_90;
          local_c0 = local_c0 + local_90;
          lVar114 = lVar114 + local_90;
          local_b8 = local_b8 + local_90;
          local_c8 = local_c8 + local_90;
          lVar109 = local_98 + local_90;
          lVar111 = local_a0 + local_90;
          lVar106 = local_a8 + local_90;
          uVar96 = local_b0 + 1;
          local_d0 = this;
          local_80 = (ulong)uVar7;
        } while (local_b0 + 1 != local_88);
      }
      uVar96 = local_d8 & 0xfffffffffffffff8;
      uVar105 = uVar103 >> 2 & 1;
      if (uVar105 != 0) {
        if (pvVar9 == (void *)0x0) {
          auVar116 = ZEXT816(0) << 0x40;
        }
        else {
          auVar116 = *(undefined1 (*) [16])((long)pvVar9 + uVar96 * 4);
        }
        pvVar12 = (this->weight_data_tm).data;
        pvVar100 = (void *)((long)pvVar12 + uVar96 * lVar104 * 4);
        if ((int)uVar112 < 8) {
          uVar107 = 0;
          lVar114 = (uVar96 | 1) * lVar104 * 4;
          lVar98 = (uVar96 | 2) * lVar104 * 4;
          lVar109 = (uVar96 | 3) * lVar104 * 4;
          auVar117 = ZEXT816(0);
          auVar118 = ZEXT816(0);
          auVar119 = ZEXT816(0);
          auVar120 = ZEXT816(0);
          pauVar95 = local_128;
        }
        else {
          uVar107 = uVar112 & 0xfffffff8;
          lVar114 = (uVar96 + 3) * lVar104;
          lVar98 = (uVar96 + 2) * lVar104;
          lVar106 = (uVar96 + 1) * lVar104;
          auVar120 = ZEXT816(0);
          iVar93 = 7;
          auVar119 = ZEXT816(0);
          auVar118 = ZEXT816(0);
          auVar117 = ZEXT816(0);
          lVar111 = 0;
          do {
            lVar110 = lVar111;
            auVar143 = *(undefined1 (*) [32])(*local_128 + lVar110);
            auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar143,
                                       *(undefined1 (*) [32])((long)pvVar100 + lVar110));
            auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),auVar143,
                                       *(undefined1 (*) [32])((long)pvVar12 + lVar110 + lVar106 * 4)
                                      );
            auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar143,
                                       *(undefined1 (*) [32])((long)pvVar12 + lVar110 + lVar98 * 4))
            ;
            auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar143,
                                       *(undefined1 (*) [32])((long)pvVar12 + lVar110 + lVar114 * 4)
                                      );
            iVar93 = iVar93 + 8;
            lVar111 = lVar110 + 0x20;
          } while (iVar93 < (int)uVar112);
          lVar109 = lVar111 + lVar114 * 4;
          lVar98 = lVar111 + lVar98 * 4;
          lVar114 = lVar111 + lVar106 * 4;
          pvVar100 = (void *)((long)pvVar100 + lVar111);
          pauVar95 = (undefined1 (*) [32])(local_128[1] + lVar110);
        }
        lVar114 = (long)pvVar12 + lVar114;
        lVar98 = (long)pvVar12 + lVar98;
        lVar109 = (long)pvVar12 + lVar109;
        auVar121 = ZEXT816(0) << 0x40;
        if ((int)(uVar107 | 3) < (int)uVar112) {
          auVar188 = ZEXT816(0);
          lVar111 = 0;
          auVar123 = ZEXT816(0);
          auVar239 = ZEXT864(0);
          uVar108 = uVar107;
          do {
            auVar128 = *(undefined1 (*) [16])(*pauVar95 + lVar111);
            auVar121 = vfmadd231ps_fma(auVar121,auVar128,
                                       *(undefined1 (*) [16])((long)pvVar100 + lVar111));
            auVar122 = vfmadd231ps_fma(auVar239._0_16_,auVar128,
                                       *(undefined1 (*) [16])(lVar114 + lVar111));
            auVar239 = ZEXT1664(auVar122);
            auVar123 = vfmadd231ps_fma(auVar123,auVar128,*(undefined1 (*) [16])(lVar98 + lVar111));
            auVar188 = vfmadd231ps_fma(auVar188,auVar128,*(undefined1 (*) [16])(lVar109 + lVar111));
            uVar107 = uVar108 + 4;
            iVar93 = uVar108 + 7;
            lVar111 = lVar111 + 0x10;
            uVar108 = uVar107;
          } while (iVar93 < (int)uVar112);
          pauVar95 = (undefined1 (*) [32])(*pauVar95 + lVar111);
          lVar109 = lVar109 + lVar111;
          lVar98 = lVar98 + lVar111;
          lVar114 = lVar114 + lVar111;
          pvVar100 = (void *)((long)pvVar100 + lVar111);
        }
        else {
          auVar122 = SUB6416(ZEXT864(0),0);
          auVar123 = ZEXT816(0);
          auVar188 = ZEXT816(0);
        }
        if (uVar112 - uVar107 != 0 && (int)uVar107 <= (int)uVar112) {
          lVar111 = 0;
          do {
            auVar128 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar100 + lVar111 * 4)),
                                     ZEXT416(*(uint *)(lVar114 + lVar111 * 4)),0x10);
            auVar128 = vinsertps_avx(auVar128,ZEXT416(*(uint *)(lVar98 + lVar111 * 4)),0x20);
            auVar128 = vinsertps_avx(auVar128,ZEXT416(*(uint *)(lVar109 + lVar111 * 4)),0x30);
            uVar5 = *(undefined4 *)(*pauVar95 + lVar111 * 4);
            auVar125._4_4_ = uVar5;
            auVar125._0_4_ = uVar5;
            auVar125._8_4_ = uVar5;
            auVar125._12_4_ = uVar5;
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar128,auVar125);
            lVar111 = lVar111 + 1;
          } while (uVar112 - uVar107 != (int)lVar111);
        }
        auVar143 = vhaddps_avx(ZEXT1632(auVar117),ZEXT1632(auVar118));
        auVar144 = vhaddps_avx(ZEXT1632(auVar119),ZEXT1632(auVar120));
        auVar143 = vhaddps_avx(auVar143,auVar144);
        auVar119 = vunpcklps_avx(auVar121,auVar122);
        auVar120 = vunpcklps_avx(auVar123,auVar188);
        auVar117 = vunpckhps_avx(auVar121,auVar122);
        auVar121 = vunpckhps_avx(auVar123,auVar188);
        auVar118 = vmovlhps_avx(auVar119,auVar120);
        auVar120 = vunpckhpd_avx(auVar119,auVar120);
        auVar119 = vmovlhps_avx(auVar117,auVar121);
        auVar121 = vunpckhpd_avx(auVar117,auVar121);
        auVar117._0_4_ =
             auVar120._0_4_ + auVar118._0_4_ + auVar119._0_4_ + auVar121._0_4_ + auVar143._0_4_ +
             auVar116._0_4_ + auVar143._16_4_;
        auVar117._4_4_ =
             auVar120._4_4_ + auVar118._4_4_ + auVar119._4_4_ + auVar121._4_4_ + auVar143._4_4_ +
             auVar116._4_4_ + auVar143._20_4_;
        auVar117._8_4_ =
             auVar120._8_4_ + auVar118._8_4_ + auVar119._8_4_ + auVar121._8_4_ + auVar143._8_4_ +
             auVar116._8_4_ + auVar143._24_4_;
        auVar117._12_4_ =
             auVar120._12_4_ + auVar118._12_4_ + auVar119._12_4_ + auVar121._12_4_ + auVar143._12_4_
             + auVar116._12_4_ + auVar143._28_4_;
        switch(uVar7) {
        case 1:
          auVar79._12_4_ = 0;
          auVar79._0_12_ = ZEXT412(0);
          auVar117 = vmaxps_avx(auVar117,auVar79 << 0x20);
          break;
        case 2:
          auVar80._12_4_ = 0;
          auVar80._0_12_ = ZEXT412(0);
          auVar116 = vmaxps_avx(auVar117,auVar80 << 0x20);
          auVar117 = vminps_avx(auVar117,auVar80 << 0x20);
          uVar5 = *(this->super_InnerProduct).activation_params.data;
          auVar48._4_4_ = uVar5;
          auVar48._0_4_ = uVar5;
          auVar48._8_4_ = uVar5;
          auVar48._12_4_ = uVar5;
          auVar117 = vfmadd132ps_avx512vl(auVar117,auVar116,auVar48);
          break;
        case 3:
          puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar5 = *puVar10;
          auVar46._4_4_ = uVar5;
          auVar46._0_4_ = uVar5;
          auVar46._8_4_ = uVar5;
          auVar46._12_4_ = uVar5;
          auVar116 = vmaxps_avx512vl(auVar117,auVar46);
          uVar5 = puVar10[1];
          auVar47._4_4_ = uVar5;
          auVar47._0_4_ = uVar5;
          auVar47._8_4_ = uVar5;
          auVar47._12_4_ = uVar5;
          auVar117 = vminps_avx512vl(auVar116,auVar47);
          break;
        case 4:
          auVar36._8_4_ = 0x80000000;
          auVar36._0_8_ = 0x8000000080000000;
          auVar36._12_4_ = 0x80000000;
          auVar116 = vxorps_avx512vl(auVar117,auVar36);
          auVar37._8_4_ = 0x42b0c0a5;
          auVar37._0_8_ = 0x42b0c0a542b0c0a5;
          auVar37._12_4_ = 0x42b0c0a5;
          auVar116 = vminps_avx512vl(auVar116,auVar37);
          auVar38._8_4_ = 0xc2b0c0a5;
          auVar38._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar38._12_4_ = 0xc2b0c0a5;
          auVar118 = vmaxps_avx512vl(auVar116,auVar38);
          auVar194._8_4_ = 0x3f000000;
          auVar194._0_8_ = 0x3f0000003f000000;
          auVar194._12_4_ = 0x3f000000;
          auVar205._8_4_ = 0x3fb8aa3b;
          auVar205._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar205._12_4_ = 0x3fb8aa3b;
          auVar117 = vfmadd213ps_fma(auVar205,auVar118,auVar194);
          auVar215._0_4_ = (int)auVar117._0_4_;
          auVar215._4_4_ = (int)auVar117._4_4_;
          auVar215._8_4_ = (int)auVar117._8_4_;
          auVar215._12_4_ = (int)auVar117._12_4_;
          auVar116 = vcvtdq2ps_avx(auVar215);
          uVar97 = vcmpps_avx512vl(auVar117,auVar116,1);
          auVar206._8_4_ = 0x3f800000;
          auVar206._0_8_ = 0x3f8000003f800000;
          auVar206._12_4_ = 0x3f800000;
          auVar117 = vsubps_avx512vl(auVar116,auVar206);
          bVar14 = (bool)((byte)uVar97 & 1);
          auVar141._0_4_ = (float)((uint)bVar14 * auVar117._0_4_ | (uint)!bVar14 * auVar116._0_4_);
          bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar141._4_4_ = (float)((uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * auVar116._4_4_);
          bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar141._8_4_ = (float)((uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * auVar116._8_4_);
          bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar141._12_4_ =
               (float)((uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * auVar116._12_4_);
          auVar39._8_4_ = 0x3f318000;
          auVar39._0_8_ = 0x3f3180003f318000;
          auVar39._12_4_ = 0x3f318000;
          auVar116 = vfmsub231ps_avx512vl(auVar118,auVar141,auVar39);
          auVar40._8_4_ = 0x395e8083;
          auVar40._0_8_ = 0x395e8083395e8083;
          auVar40._12_4_ = 0x395e8083;
          auVar117 = vfmsub231ps_avx512vl(auVar116,auVar141,auVar40);
          auVar220._8_4_ = 0x39506967;
          auVar220._0_8_ = 0x3950696739506967;
          auVar220._12_4_ = 0x39506967;
          auVar41._8_4_ = 0x3ab743ce;
          auVar41._0_8_ = 0x3ab743ce3ab743ce;
          auVar41._12_4_ = 0x3ab743ce;
          auVar116 = vfmadd213ps_avx512vl(auVar220,auVar117,auVar41);
          auVar42._8_4_ = 0x3c088908;
          auVar42._0_8_ = 0x3c0889083c088908;
          auVar42._12_4_ = 0x3c088908;
          auVar116 = vfmadd213ps_avx512vl(auVar116,auVar117,auVar42);
          auVar43._8_4_ = 0x3d2aa9c1;
          auVar43._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar43._12_4_ = 0x3d2aa9c1;
          auVar116 = vfmadd213ps_avx512vl(auVar116,auVar117,auVar43);
          auVar225._0_4_ = auVar117._0_4_ * auVar117._0_4_;
          auVar225._4_4_ = auVar117._4_4_ * auVar117._4_4_;
          auVar225._8_4_ = auVar117._8_4_ * auVar117._8_4_;
          auVar225._12_4_ = auVar117._12_4_ * auVar117._12_4_;
          auVar44._8_4_ = 0x3e2aaaaa;
          auVar44._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar44._12_4_ = 0x3e2aaaaa;
          auVar116 = vfmadd213ps_avx512vl(auVar116,auVar117,auVar44);
          auVar116 = vfmadd213ps_fma(auVar116,auVar117,auVar194);
          auVar116 = vfmadd213ps_fma(auVar116,auVar225,auVar117);
          auVar189._0_4_ = auVar116._0_4_ + 1.0;
          auVar189._4_4_ = auVar116._4_4_ + 1.0;
          auVar189._8_4_ = auVar116._8_4_ + 1.0;
          auVar189._12_4_ = auVar116._12_4_ + 1.0;
          auVar195._0_4_ = (int)auVar141._0_4_;
          auVar195._4_4_ = (int)auVar141._4_4_;
          auVar195._8_4_ = (int)auVar141._8_4_;
          auVar195._12_4_ = (int)auVar141._12_4_;
          auVar116 = vpslld_avx(auVar195,0x17);
          auVar45._8_4_ = 0x3f800000;
          auVar45._0_8_ = 0x3f8000003f800000;
          auVar45._12_4_ = 0x3f800000;
          auVar116 = vpaddd_avx512vl(auVar116,auVar45);
          auVar116 = vfmadd213ps_fma(auVar116,auVar189,auVar206);
          auVar117 = vdivps_avx(auVar206,auVar116);
          break;
        case 5:
          auVar228._8_4_ = 0x42b0c0a5;
          auVar228._0_8_ = 0x42b0c0a542b0c0a5;
          auVar228._12_4_ = 0x42b0c0a5;
          auVar231._8_4_ = 0xc2b0c0a5;
          auVar231._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar231._12_4_ = 0xc2b0c0a5;
          auVar116 = vminps_avx(auVar117,auVar228);
          auVar118 = vmaxps_avx(auVar116,auVar231);
          auVar218._8_4_ = 0x3fb8aa3b;
          auVar218._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar218._12_4_ = 0x3fb8aa3b;
          auVar203._8_4_ = 0x3f000000;
          auVar203._0_8_ = 0x3f0000003f000000;
          auVar203._12_4_ = 0x3f000000;
          auVar119 = vfmadd213ps_fma(auVar218,auVar118,auVar203);
          auVar212._0_4_ = (int)auVar119._0_4_;
          auVar212._4_4_ = (int)auVar119._4_4_;
          auVar212._8_4_ = (int)auVar119._8_4_;
          auVar212._12_4_ = (int)auVar119._12_4_;
          auVar116 = vcvtdq2ps_avx(auVar212);
          uVar97 = vcmpps_avx512vl(auVar119,auVar116,1);
          auVar192._8_4_ = 0x3f800000;
          auVar192._0_8_ = 0x3f8000003f800000;
          auVar192._12_4_ = 0x3f800000;
          auVar213._8_4_ = 0x3f318000;
          auVar213._0_8_ = 0x3f3180003f318000;
          auVar213._12_4_ = 0x3f318000;
          auVar119 = vsubps_avx512vl(auVar116,auVar192);
          bVar14 = (bool)((byte)uVar97 & 1);
          auVar136._0_4_ = (float)((uint)bVar14 * auVar119._0_4_ | (uint)!bVar14 * auVar116._0_4_);
          bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar136._4_4_ = (float)((uint)bVar14 * auVar119._4_4_ | (uint)!bVar14 * auVar116._4_4_);
          bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar136._8_4_ = (float)((uint)bVar14 * auVar119._8_4_ | (uint)!bVar14 * auVar116._8_4_);
          bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar136._12_4_ =
               (float)((uint)bVar14 * auVar119._12_4_ | (uint)!bVar14 * auVar116._12_4_);
          auVar116 = vfmsub231ps_fma(auVar118,auVar136,auVar213);
          auVar236._8_4_ = 0xb95e8083;
          auVar236._0_8_ = 0xb95e8083b95e8083;
          auVar236._12_4_ = 0xb95e8083;
          auVar116 = vfnmsub231ps_fma(auVar116,auVar136,auVar236);
          auVar118 = vmulps_avx512vl(auVar116,auVar116);
          auVar241._8_4_ = 0x3ab743ce;
          auVar241._0_8_ = 0x3ab743ce3ab743ce;
          auVar241._12_4_ = 0x3ab743ce;
          auVar224._8_4_ = 0x39506967;
          auVar224._0_8_ = 0x3950696739506967;
          auVar224._12_4_ = 0x39506967;
          auVar119 = vfmadd213ps_avx512vl(auVar224,auVar116,auVar241);
          auVar244._8_4_ = 0x3c088908;
          auVar244._0_8_ = 0x3c0889083c088908;
          auVar244._12_4_ = 0x3c088908;
          auVar247._8_4_ = 0x3d2aa9c1;
          auVar247._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar247._12_4_ = 0x3d2aa9c1;
          auVar119 = vfmadd213ps_avx512vl(auVar119,auVar116,auVar244);
          auVar119 = vfmadd213ps_avx512vl(auVar119,auVar116,auVar247);
          auVar250._8_4_ = 0x3e2aaaaa;
          auVar250._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar250._12_4_ = 0x3e2aaaaa;
          auVar119 = vfmadd213ps_avx512vl(auVar119,auVar116,auVar250);
          auVar119 = vfmadd213ps_avx512vl(auVar119,auVar116,auVar203);
          auVar116 = vfmadd213ps_avx512vl(auVar119,auVar118,auVar116);
          auVar118 = vaddps_avx512vl(auVar116,auVar192);
          auVar253._0_4_ = (int)auVar136._0_4_;
          auVar253._4_4_ = (int)auVar136._4_4_;
          auVar253._8_4_ = (int)auVar136._8_4_;
          auVar253._12_4_ = (int)auVar136._12_4_;
          auVar116 = vpslld_avx(auVar253,0x17);
          auVar254._8_4_ = 0x3f800000;
          auVar254._0_8_ = 0x3f8000003f800000;
          auVar254._12_4_ = 0x3f800000;
          auVar116 = vpaddd_avx(auVar116,auVar254);
          auVar116 = vfmadd213ps_avx512vl(auVar116,auVar118,auVar192);
          auVar120._8_4_ = 0x800000;
          auVar120._0_8_ = 0x80000000800000;
          auVar120._12_4_ = 0x800000;
          auVar118 = vmaxps_avx512vl(auVar116,auVar120);
          uVar97 = vcmpps_avx512vl(auVar116,ZEXT816(0) << 0x40,2);
          auVar116 = vpsrld_avx512vl(auVar118,0x17);
          auVar259._8_4_ = 0x3f000000;
          auVar259._0_8_ = 0x3f0000003f000000;
          auVar259._12_4_ = 0x3f000000;
          auVar121._8_4_ = 0x807fffff;
          auVar121._0_8_ = 0x807fffff807fffff;
          auVar121._12_4_ = 0x807fffff;
          auVar118 = vpternlogd_avx512vl(auVar259,auVar118,auVar121,0xf8);
          auVar122._8_4_ = 0xffffff82;
          auVar122._0_8_ = 0xffffff82ffffff82;
          auVar122._12_4_ = 0xffffff82;
          auVar116 = vpaddd_avx512vl(auVar116,auVar122);
          auVar123._8_4_ = 0x3f3504f3;
          auVar123._0_8_ = 0x3f3504f33f3504f3;
          auVar123._12_4_ = 0x3f3504f3;
          uVar16 = vcmpps_avx512vl(auVar118,auVar123,1);
          auVar188._8_4_ = 0xbf800000;
          auVar188._0_8_ = 0xbf800000bf800000;
          auVar188._12_4_ = 0xbf800000;
          auVar119 = vaddps_avx512vl(auVar118,auVar188);
          auVar116 = vcvtdq2ps_avx(auVar116);
          auVar120 = vsubps_avx512vl(auVar116,auVar192);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar137._0_4_ = (uint)bVar14 * auVar120._0_4_ | (uint)!bVar14 * auVar116._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar137._4_4_ = (uint)bVar14 * auVar120._4_4_ | (uint)!bVar14 * auVar116._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar137._8_4_ = (uint)bVar14 * auVar120._8_4_ | (uint)!bVar14 * auVar116._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar137._12_4_ = (uint)bVar14 * auVar120._12_4_ | (uint)!bVar14 * auVar116._12_4_;
          auVar116 = vaddps_avx512vl(auVar119,auVar118);
          bVar14 = (bool)((byte)uVar16 & 1);
          auVar138._0_4_ = (uint)bVar14 * auVar116._0_4_ | (uint)!bVar14 * auVar119._0_4_;
          bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar138._4_4_ = (uint)bVar14 * auVar116._4_4_ | (uint)!bVar14 * auVar119._4_4_;
          bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar138._8_4_ = (uint)bVar14 * auVar116._8_4_ | (uint)!bVar14 * auVar119._8_4_;
          bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar138._12_4_ = (uint)bVar14 * auVar116._12_4_ | (uint)!bVar14 * auVar119._12_4_;
          auVar116 = vmulps_avx512vl(auVar138,auVar138);
          auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar128._8_4_ = 0xbdebd1b8;
          auVar128._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar128._12_4_ = 0xbdebd1b8;
          auVar118 = vfmadd213ps_avx512vl(auVar118,auVar138,auVar128);
          auVar124._8_4_ = 0x3def251a;
          auVar124._0_8_ = 0x3def251a3def251a;
          auVar124._12_4_ = 0x3def251a;
          auVar118 = vfmadd213ps_avx512vl(auVar118,auVar138,auVar124);
          auVar126._8_4_ = 0xbdfe5d4f;
          auVar126._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar126._12_4_ = 0xbdfe5d4f;
          auVar118 = vfmadd213ps_avx512vl(auVar118,auVar138,auVar126);
          auVar127._8_4_ = 0x3e11e9bf;
          auVar127._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar127._12_4_ = 0x3e11e9bf;
          auVar118 = vfmadd213ps_avx512vl(auVar118,auVar138,auVar127);
          auVar32._8_4_ = 0xbe2aae50;
          auVar32._0_8_ = 0xbe2aae50be2aae50;
          auVar32._12_4_ = 0xbe2aae50;
          auVar118 = vfmadd213ps_avx512vl(auVar118,auVar138,auVar32);
          auVar33._8_4_ = 0x3e4cceac;
          auVar33._0_8_ = 0x3e4cceac3e4cceac;
          auVar33._12_4_ = 0x3e4cceac;
          auVar118 = vfmadd213ps_avx512vl(auVar118,auVar138,auVar33);
          auVar34._8_4_ = 0xbe7ffffc;
          auVar34._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar34._12_4_ = 0xbe7ffffc;
          auVar118 = vfmadd213ps_avx512vl(auVar118,auVar138,auVar34);
          auVar35._8_4_ = 0x3eaaaaaa;
          auVar35._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar35._12_4_ = 0x3eaaaaaa;
          auVar118 = vfmadd213ps_avx512vl(auVar118,auVar138,auVar35);
          auVar119 = vmulps_avx512vl(auVar116,auVar138);
          auVar118 = vmulps_avx512vl(auVar119,auVar118);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar137,auVar236);
          auVar116 = vfmsub231ps_avx512vl(auVar118,auVar203,auVar116);
          auVar116 = vsubps_avx512vl(auVar116,auVar138);
          auVar116 = vfnmadd231ps_fma(auVar116,auVar213,auVar137);
          auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar14 = (bool)((byte)uVar97 & 1);
          auVar139._0_4_ =
               (uint)bVar14 * auVar118._0_4_ |
               (uint)!bVar14 * (int)(auVar116._0_4_ + auVar116._0_4_);
          bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar139._4_4_ =
               (uint)bVar14 * auVar118._4_4_ |
               (uint)!bVar14 * (int)(auVar116._4_4_ + auVar116._4_4_);
          bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar139._8_4_ =
               (uint)bVar14 * auVar118._8_4_ |
               (uint)!bVar14 * (int)(auVar116._8_4_ + auVar116._8_4_);
          bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar139._12_4_ =
               (uint)bVar14 * auVar118._12_4_ |
               (uint)!bVar14 * (int)(auVar116._12_4_ + auVar116._12_4_);
          auVar116 = vminps_avx(auVar139,auVar228);
          auVar118 = vmaxps_avx(auVar116,auVar231);
          auVar119 = vfmadd213ps_fma(auVar218,auVar118,auVar203);
          auVar232._0_4_ = (int)auVar119._0_4_;
          auVar232._4_4_ = (int)auVar119._4_4_;
          auVar232._8_4_ = (int)auVar119._8_4_;
          auVar232._12_4_ = (int)auVar119._12_4_;
          auVar116 = vcvtdq2ps_avx(auVar232);
          uVar97 = vcmpps_avx512vl(auVar119,auVar116,1);
          auVar119 = vsubps_avx512vl(auVar116,auVar192);
          bVar14 = (bool)((byte)uVar97 & 1);
          auVar140._0_4_ = (float)((uint)bVar14 * auVar119._0_4_ | (uint)!bVar14 * auVar116._0_4_);
          bVar14 = (bool)((byte)(uVar97 >> 1) & 1);
          auVar140._4_4_ = (float)((uint)bVar14 * auVar119._4_4_ | (uint)!bVar14 * auVar116._4_4_);
          bVar14 = (bool)((byte)(uVar97 >> 2) & 1);
          auVar140._8_4_ = (float)((uint)bVar14 * auVar119._8_4_ | (uint)!bVar14 * auVar116._8_4_);
          bVar14 = (bool)((byte)(uVar97 >> 3) & 1);
          auVar140._12_4_ =
               (float)((uint)bVar14 * auVar119._12_4_ | (uint)!bVar14 * auVar116._12_4_);
          auVar116 = vfmsub213ps_fma(auVar213,auVar140,auVar118);
          auVar118 = vfnmsub231ps_fma(auVar116,auVar140,auVar236);
          auVar219._0_4_ = auVar118._0_4_ * auVar118._0_4_;
          auVar219._4_4_ = auVar118._4_4_ * auVar118._4_4_;
          auVar219._8_4_ = auVar118._8_4_ * auVar118._8_4_;
          auVar219._12_4_ = auVar118._12_4_ * auVar118._12_4_;
          auVar116 = vfmadd213ps_fma(auVar224,auVar118,auVar241);
          auVar116 = vfmadd213ps_fma(auVar116,auVar118,auVar244);
          auVar116 = vfmadd213ps_fma(auVar116,auVar118,auVar247);
          auVar116 = vfmadd213ps_fma(auVar116,auVar118,auVar250);
          auVar116 = vfmadd213ps_fma(auVar116,auVar118,auVar203);
          auVar116 = vfmadd213ps_fma(auVar116,auVar219,auVar118);
          auVar204._0_4_ = auVar116._0_4_ + 1.0;
          auVar204._4_4_ = auVar116._4_4_ + 1.0;
          auVar204._8_4_ = auVar116._8_4_ + 1.0;
          auVar204._12_4_ = auVar116._12_4_ + 1.0;
          auVar214._0_4_ = (int)auVar140._0_4_;
          auVar214._4_4_ = (int)auVar140._4_4_;
          auVar214._8_4_ = (int)auVar140._8_4_;
          auVar214._12_4_ = (int)auVar140._12_4_;
          auVar116 = vpslld_avx(auVar214,0x17);
          auVar116 = vpaddd_avx(auVar254,auVar116);
          auVar116 = vfmadd213ps_fma(auVar116,auVar204,auVar192);
          auVar193._8_4_ = 0x40000000;
          auVar193._0_8_ = 0x4000000040000000;
          auVar193._12_4_ = 0x40000000;
          auVar116 = vdivps_avx(auVar193,auVar116);
          auVar117 = vfmsub231ps_fma(auVar117,auVar117,auVar116);
          break;
        case 6:
          puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar5 = *puVar10;
          auVar119._4_4_ = uVar5;
          auVar119._0_4_ = uVar5;
          auVar119._8_4_ = uVar5;
          auVar119._12_4_ = uVar5;
          uVar5 = puVar10[1];
          auVar116._4_4_ = uVar5;
          auVar116._0_4_ = uVar5;
          auVar116._8_4_ = uVar5;
          auVar116._12_4_ = uVar5;
          auVar116 = vfmadd213ps_avx512vl(auVar119,auVar117,auVar116);
          auVar116 = vmaxps_avx(auVar116,ZEXT816(0) << 0x20);
          auVar118._8_4_ = 0x3f800000;
          auVar118._0_8_ = 0x3f8000003f800000;
          auVar118._12_4_ = 0x3f800000;
          auVar116 = vminps_avx512vl(auVar116,auVar118);
          auVar117._0_4_ = auVar116._0_4_ * auVar117._0_4_;
          auVar117._4_4_ = auVar116._4_4_ * auVar117._4_4_;
          auVar117._8_4_ = auVar116._8_4_ * auVar117._8_4_;
          auVar117._12_4_ = auVar116._12_4_ * auVar117._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar96 * 4) = auVar117;
      }
      iVar93 = 0;
      iVar94 = (int)uVar96 + uVar105 * 4;
      if (iVar94 < (int)uVar103) {
        pfVar13 = (float *)(this->super_InnerProduct).activation_params.data;
        pvVar100 = (this->weight_data_tm).data;
        pvVar12 = top_blob->data;
        local_140 = uVar112 & 0xfffffff8;
        uVar96 = (ulong)iVar94;
        auVar261 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar239 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          fVar187 = 0.0;
          if (pvVar9 != (void *)0x0) {
            fVar187 = *(float *)((long)pvVar9 + uVar96 * 4);
          }
          pauVar95 = (undefined1 (*) [32])((long)pvVar100 + uVar96 * lVar104 * 4);
          pauVar99 = pauVar101;
          if ((int)uVar112 < 8) {
            auVar143 = SUB6432(ZEXT864(0),0);
            uVar103 = 0;
          }
          else {
            auVar209 = ZEXT864(0);
            iVar93 = 7;
            do {
              auVar116 = vfmadd231ps_fma(auVar209._0_32_,*pauVar99,*pauVar95);
              auVar209 = ZEXT1664(auVar116);
              auVar143 = ZEXT1632(auVar116);
              pauVar99 = pauVar99 + 1;
              pauVar95 = pauVar95 + 1;
              iVar93 = iVar93 + 8;
              uVar103 = local_140;
            } while (iVar93 < (int)uVar112);
          }
          auVar116 = ZEXT816(0) << 0x40;
          uVar105 = uVar103 | 3;
          while ((int)uVar105 < (int)uVar112) {
            auVar116 = vfmadd231ps_fma(auVar116,*(undefined1 (*) [16])*pauVar99,
                                       *(undefined1 (*) [16])*pauVar95);
            pauVar99 = (undefined1 (*) [32])(*pauVar99 + 0x10);
            pauVar95 = (undefined1 (*) [32])(*pauVar95 + 0x10);
            uVar105 = uVar103 + 7;
            uVar103 = uVar103 + 4;
          }
          if ((int)uVar103 < (int)uVar112) {
            auVar222 = vpbroadcastq_avx512f();
            uVar97 = 0;
            auVar209 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),fVar187));
            do {
              auVar242 = auVar209;
              auVar209 = vpbroadcastq_avx512f();
              auVar233 = vporq_avx512f(auVar209,auVar261);
              auVar209 = vporq_avx512f(auVar209,auVar239);
              uVar18 = vpcmpuq_avx512f(auVar209,auVar222,2);
              bVar15 = (byte)uVar18;
              uVar18 = vpcmpuq_avx512f(auVar233,auVar222,2);
              bVar78 = (byte)uVar18;
              uVar115 = CONCAT11(bVar78,bVar15);
              piVar8 = (int *)(*pauVar99 + uVar97 * 4);
              auVar209._4_4_ = (uint)((byte)(uVar115 >> 1) & 1) * piVar8[1];
              auVar209._0_4_ = (uint)(bVar15 & 1) * *piVar8;
              auVar209._8_4_ = (uint)((byte)(uVar115 >> 2) & 1) * piVar8[2];
              auVar209._12_4_ = (uint)((byte)(uVar115 >> 3) & 1) * piVar8[3];
              auVar209._16_4_ = (uint)((byte)(uVar115 >> 4) & 1) * piVar8[4];
              auVar209._20_4_ = (uint)((byte)(uVar115 >> 5) & 1) * piVar8[5];
              auVar209._24_4_ = (uint)((byte)(uVar115 >> 6) & 1) * piVar8[6];
              auVar209._28_4_ = (uint)((byte)(uVar115 >> 7) & 1) * piVar8[7];
              auVar209._32_4_ = (uint)(bVar78 & 1) * piVar8[8];
              auVar209._36_4_ = (uint)(bVar78 >> 1 & 1) * piVar8[9];
              auVar209._40_4_ = (uint)(bVar78 >> 2 & 1) * piVar8[10];
              auVar209._44_4_ = (uint)(bVar78 >> 3 & 1) * piVar8[0xb];
              auVar209._48_4_ = (uint)(bVar78 >> 4 & 1) * piVar8[0xc];
              auVar209._52_4_ = (uint)(bVar78 >> 5 & 1) * piVar8[0xd];
              auVar209._56_4_ = (uint)(bVar78 >> 6 & 1) * piVar8[0xe];
              auVar209._60_4_ = (uint)(bVar78 >> 7) * piVar8[0xf];
              piVar8 = (int *)(*pauVar95 + uVar97 * 4);
              auVar233._4_4_ = (uint)((byte)(uVar115 >> 1) & 1) * piVar8[1];
              auVar233._0_4_ = (uint)(bVar15 & 1) * *piVar8;
              auVar233._8_4_ = (uint)((byte)(uVar115 >> 2) & 1) * piVar8[2];
              auVar233._12_4_ = (uint)((byte)(uVar115 >> 3) & 1) * piVar8[3];
              auVar233._16_4_ = (uint)((byte)(uVar115 >> 4) & 1) * piVar8[4];
              auVar233._20_4_ = (uint)((byte)(uVar115 >> 5) & 1) * piVar8[5];
              auVar233._24_4_ = (uint)((byte)(uVar115 >> 6) & 1) * piVar8[6];
              auVar233._28_4_ = (uint)((byte)(uVar115 >> 7) & 1) * piVar8[7];
              auVar233._32_4_ = (uint)(bVar78 & 1) * piVar8[8];
              auVar233._36_4_ = (uint)(bVar78 >> 1 & 1) * piVar8[9];
              auVar233._40_4_ = (uint)(bVar78 >> 2 & 1) * piVar8[10];
              auVar233._44_4_ = (uint)(bVar78 >> 3 & 1) * piVar8[0xb];
              auVar233._48_4_ = (uint)(bVar78 >> 4 & 1) * piVar8[0xc];
              auVar233._52_4_ = (uint)(bVar78 >> 5 & 1) * piVar8[0xd];
              auVar233._56_4_ = (uint)(bVar78 >> 6 & 1) * piVar8[0xe];
              auVar233._60_4_ = (uint)(bVar78 >> 7) * piVar8[0xf];
              auVar209 = vfmadd213ps_avx512f(auVar233,auVar209,auVar242);
              uVar97 = uVar97 + 0x10;
            } while (((ulong)(~uVar103 + uVar112) + 0x10 & 0xfffffffffffffff0) != uVar97);
            auVar222._0_4_ =
                 (uint)(bVar15 & 1) * auVar209._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar242._0_4_;
            bVar14 = (bool)((byte)(uVar115 >> 1) & 1);
            auVar222._4_4_ = (uint)bVar14 * auVar209._4_4_ | (uint)!bVar14 * auVar242._4_4_;
            bVar14 = (bool)((byte)(uVar115 >> 2) & 1);
            auVar222._8_4_ = (uint)bVar14 * auVar209._8_4_ | (uint)!bVar14 * auVar242._8_4_;
            bVar14 = (bool)((byte)(uVar115 >> 3) & 1);
            auVar222._12_4_ = (uint)bVar14 * auVar209._12_4_ | (uint)!bVar14 * auVar242._12_4_;
            bVar14 = (bool)((byte)(uVar115 >> 4) & 1);
            auVar222._16_4_ = (uint)bVar14 * auVar209._16_4_ | (uint)!bVar14 * auVar242._16_4_;
            bVar14 = (bool)((byte)(uVar115 >> 5) & 1);
            auVar222._20_4_ = (uint)bVar14 * auVar209._20_4_ | (uint)!bVar14 * auVar242._20_4_;
            bVar14 = (bool)((byte)(uVar115 >> 6) & 1);
            auVar222._24_4_ = (uint)bVar14 * auVar209._24_4_ | (uint)!bVar14 * auVar242._24_4_;
            bVar14 = (bool)((byte)(uVar115 >> 7) & 1);
            auVar222._28_4_ = (uint)bVar14 * auVar209._28_4_ | (uint)!bVar14 * auVar242._28_4_;
            auVar222._32_4_ =
                 (uint)(bVar78 & 1) * auVar209._32_4_ | (uint)!(bool)(bVar78 & 1) * auVar242._32_4_;
            bVar14 = (bool)(bVar78 >> 1 & 1);
            auVar222._36_4_ = (uint)bVar14 * auVar209._36_4_ | (uint)!bVar14 * auVar242._36_4_;
            bVar14 = (bool)(bVar78 >> 2 & 1);
            auVar222._40_4_ = (uint)bVar14 * auVar209._40_4_ | (uint)!bVar14 * auVar242._40_4_;
            bVar14 = (bool)(bVar78 >> 3 & 1);
            auVar222._44_4_ = (uint)bVar14 * auVar209._44_4_ | (uint)!bVar14 * auVar242._44_4_;
            bVar14 = (bool)(bVar78 >> 4 & 1);
            auVar222._48_4_ = (uint)bVar14 * auVar209._48_4_ | (uint)!bVar14 * auVar242._48_4_;
            bVar14 = (bool)(bVar78 >> 5 & 1);
            auVar222._52_4_ = (uint)bVar14 * auVar209._52_4_ | (uint)!bVar14 * auVar242._52_4_;
            bVar14 = (bool)(bVar78 >> 6 & 1);
            auVar222._56_4_ = (uint)bVar14 * auVar209._56_4_ | (uint)!bVar14 * auVar242._56_4_;
            auVar222._60_4_ =
                 (uint)(bVar78 >> 7) * auVar209._60_4_ |
                 (uint)!(bool)(bVar78 >> 7) * auVar242._60_4_;
            auVar144 = vextractf64x4_avx512f(auVar222,1);
            auVar209 = vaddps_avx512f(auVar222,ZEXT3264(auVar144));
            auVar196._0_4_ = auVar209._0_4_ + auVar209._16_4_;
            auVar196._4_4_ = auVar209._4_4_ + auVar209._20_4_;
            auVar196._8_4_ = auVar209._8_4_ + auVar209._24_4_;
            auVar196._12_4_ = auVar209._12_4_ + auVar209._28_4_;
            auVar117 = vshufpd_avx(auVar196,auVar196,1);
            auVar197._0_4_ = auVar196._0_4_ + auVar117._0_4_;
            auVar197._4_4_ = auVar196._4_4_ + auVar117._4_4_;
            auVar197._8_4_ = auVar196._8_4_ + auVar117._8_4_;
            auVar197._12_4_ = auVar196._12_4_ + auVar117._12_4_;
            auVar117 = vhaddps_avx(auVar197,auVar197);
            fVar187 = auVar117._0_4_;
          }
          auVar190._0_4_ = auVar143._0_4_ + auVar143._16_4_ + auVar116._0_4_;
          auVar190._4_4_ = auVar143._4_4_ + auVar143._20_4_ + auVar116._4_4_;
          auVar190._8_4_ = auVar143._8_4_ + auVar143._24_4_ + auVar116._8_4_;
          auVar190._12_4_ = auVar143._12_4_ + auVar143._28_4_ + auVar116._12_4_;
          auVar116 = vhaddps_avx(auVar190,auVar190);
          auVar116 = vhaddps_avx(auVar116,auVar116);
          fVar187 = auVar116._0_4_ + fVar187;
          fVar186 = fVar187;
          if (uVar7 - 1 < 6) {
            auVar116 = ZEXT416((uint)fVar187);
            switch(uVar7) {
            case 1:
              auVar116 = vmaxss_avx(auVar116,ZEXT416(0));
              fVar186 = auVar116._0_4_;
              break;
            case 2:
              uVar18 = vcmpss_avx512f(auVar116,ZEXT416(0),0xe);
              bVar14 = (bool)((byte)uVar18 & 1);
              fVar186 = (float)((uint)bVar14 * 0x3f800000 + (uint)!bVar14 * (int)*pfVar13) * fVar187
              ;
              break;
            case 3:
              auVar116 = vmaxss_avx(auVar116,ZEXT416((uint)*pfVar13));
              fVar186 = auVar116._0_4_;
              if (pfVar13[1] < auVar116._0_4_) {
                fVar186 = pfVar13[1];
              }
              break;
            case 4:
              auVar116 = vminss_avx(auVar116,SUB6416(ZEXT464(0x42b0c0a5),0));
              auVar50._8_4_ = 0x80000000;
              auVar50._0_8_ = 0x8000000080000000;
              auVar50._12_4_ = 0x80000000;
              auVar117 = vxorps_avx512vl(auVar116,auVar50);
              uVar18 = vcmpss_avx512f(auVar116,ZEXT416(0xc2b0c0a5),1);
              bVar14 = (bool)((byte)uVar18 & 1);
              fVar187 = expf((float)((uint)bVar14 * 0x42b0c0a5 + (uint)!bVar14 * auVar117._0_4_));
              auVar239 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar261 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              fVar186 = 1.0 / (fVar187 + 1.0);
              break;
            case 5:
              fVar186 = expf(fVar187);
              fVar186 = logf(fVar186 + 1.0);
              fVar186 = tanhf(fVar186);
              auVar239 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar261 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              fVar186 = fVar186 * fVar187;
              break;
            case 6:
              fVar6 = *pfVar13;
              auVar49._8_4_ = 0x80000000;
              auVar49._0_8_ = 0x8000000080000000;
              auVar49._12_4_ = 0x80000000;
              auVar116 = vxorps_avx512vl(ZEXT416((uint)pfVar13[1]),auVar49);
              fVar210 = auVar116._0_4_ / fVar6;
              fVar186 = 0.0;
              if ((fVar210 <= fVar187) && (fVar186 = fVar187, fVar187 <= fVar210 + 1.0 / fVar6)) {
                auVar116 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar187),
                                           ZEXT416((uint)pfVar13[1]));
                fVar186 = auVar116._0_4_ * fVar187;
              }
            }
          }
          *(float *)((long)pvVar12 + uVar96 * 4) = fVar186;
          uVar96 = uVar96 + 1;
          iVar93 = 0;
        } while (uVar96 != local_d8);
      }
      goto LAB_002b8f8b;
    }
    iVar93 = 0;
    if ((iVar94 != 4) || ((int)uVar103 < 1)) goto LAB_002b8f8b;
    uVar97 = 0;
    auVar188 = ZEXT816(0);
    auVar202._8_4_ = 0x42b0c0a5;
    auVar202._0_8_ = 0x42b0c0a542b0c0a5;
    auVar202._12_4_ = 0x42b0c0a5;
    auVar211._8_4_ = 0xc2b0c0a5;
    auVar211._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar211._12_4_ = 0xc2b0c0a5;
    auVar217._8_4_ = 0x3f000000;
    auVar217._0_8_ = 0x3f0000003f000000;
    auVar217._12_4_ = 0x3f000000;
    auVar223._8_4_ = 0x3fb8aa3b;
    auVar223._0_8_ = 0x3fb8aa3b3fb8aa3b;
    auVar223._12_4_ = 0x3fb8aa3b;
    auVar227._8_4_ = 0x3f800000;
    auVar227._0_8_ = 0x3f8000003f800000;
    auVar227._12_4_ = 0x3f800000;
    auVar230._8_4_ = 0x3f318000;
    auVar230._0_8_ = 0x3f3180003f318000;
    auVar230._12_4_ = 0x3f318000;
    auVar240._8_4_ = 0x39506967;
    auVar240._0_8_ = 0x3950696739506967;
    auVar240._12_4_ = 0x39506967;
    auVar243._8_4_ = 0x3ab743ce;
    auVar243._0_8_ = 0x3ab743ce3ab743ce;
    auVar243._12_4_ = 0x3ab743ce;
    auVar246._8_4_ = 0x3c088908;
    auVar246._0_8_ = 0x3c0889083c088908;
    auVar246._12_4_ = 0x3c088908;
    auVar249._8_4_ = 0x3d2aa9c1;
    auVar249._0_8_ = 0x3d2aa9c13d2aa9c1;
    auVar249._12_4_ = 0x3d2aa9c1;
    auVar252._8_4_ = 0x3e2aaaaa;
    auVar252._0_8_ = 0x3e2aaaaa3e2aaaaa;
    auVar252._12_4_ = 0x3e2aaaaa;
    auVar256._8_4_ = 0x3f800000;
    auVar256._0_8_ = 0x3f8000003f800000;
    auVar256._12_4_ = 0x3f800000;
    auVar258._8_4_ = 0xb95e8083;
    auVar258._0_8_ = 0xb95e8083b95e8083;
    auVar258._12_4_ = 0xb95e8083;
    auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
    auVar117 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
    auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
    auVar119 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
    auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
    auVar121 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
    auVar122 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
    auVar123 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    do {
      auVar128 = ZEXT816(0) << 0x40;
      if (pvVar9 != (void *)0x0) {
        auVar128 = *(undefined1 (*) [16])((long)pvVar9 + uVar97 * 0x10);
      }
      pauVar101 = (undefined1 (*) [32])
                  ((long)(this->weight_data_tm).w * uVar97 * (this->weight_data_tm).elemsize +
                  (long)(this->weight_data_tm).data);
      auVar124 = in_ZMM17._0_16_;
      auVar126 = in_ZMM18._0_16_;
      auVar125 = in_ZMM16._0_16_;
      pauVar95 = local_128;
      if ((int)uVar112 < 8) {
        auVar125 = vxorps_avx512vl(auVar125,auVar125);
        auVar143 = ZEXT1632(auVar125);
        auVar125 = vxorps_avx512vl(auVar126,auVar126);
        in_ZMM18 = ZEXT1664(auVar125);
        auVar125 = vxorps_avx512vl(auVar124,auVar124);
        in_ZMM17 = ZEXT1664(auVar125);
        auVar239 = ZEXT864(0);
        uVar103 = 0;
      }
      else {
        auVar239 = ZEXT864(0);
        iVar93 = 7;
        auVar124 = vxorps_avx512vl(auVar124,auVar124);
        in_ZMM17 = ZEXT1664(auVar124);
        auVar124 = vxorps_avx512vl(auVar126,auVar126);
        in_ZMM18 = ZEXT1664(auVar124);
        auVar125 = vxorps_avx512vl(auVar125,auVar125);
        auVar261 = ZEXT1664(auVar125);
        do {
          auVar125 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar95));
          auVar124 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 4)));
          auVar126 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 8)));
          auVar127 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 0xc)));
          auVar143 = vinsertf32x4_avx512vl(ZEXT1632(auVar125),auVar124,1);
          auVar144 = vinsertf32x4_avx512vl(ZEXT1632(auVar126),auVar127,1);
          auVar125 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 0x10)));
          auVar124 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 0x14)));
          auVar126 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 0x18)));
          auVar145 = vinsertf32x4_avx512vl(ZEXT1632(auVar125),auVar124,1);
          auVar125 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 0x1c)));
          auVar146 = vinsertf32x4_avx512vl(ZEXT1632(auVar126),auVar125,1);
          auVar143 = vfmadd231ps_avx512vl(auVar239._0_32_,auVar143,*pauVar101);
          auVar239 = ZEXT3264(auVar143);
          auVar143 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar144,pauVar101[1]);
          in_ZMM17 = ZEXT3264(auVar143);
          auVar143 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar145,pauVar101[2]);
          in_ZMM18 = ZEXT3264(auVar143);
          auVar143 = vfmadd231ps_avx512vl(auVar261._0_32_,auVar146,pauVar101[3]);
          auVar261 = ZEXT3264(auVar143);
          pauVar95 = pauVar95 + 1;
          pauVar101 = pauVar101 + 4;
          iVar93 = iVar93 + 8;
          uVar103 = uVar112 & 0xfffffff8;
        } while (iVar93 < (int)uVar112);
      }
      auVar144 = auVar239._0_32_;
      uVar105 = uVar103 | 3;
      while ((int)uVar105 < (int)uVar112) {
        auVar125 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar95));
        auVar124 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 4)));
        auVar126 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 8)));
        auVar127 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 0xc)));
        auVar144 = vinsertf32x4_avx512vl(ZEXT1632(auVar125),auVar124,1);
        auVar145 = vinsertf32x4_avx512vl(ZEXT1632(auVar126),auVar127,1);
        auVar144 = vfmadd231ps_avx512vl(auVar239._0_32_,auVar144,*pauVar101);
        auVar239 = ZEXT3264(auVar144);
        auVar145 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar145,pauVar101[1]);
        in_ZMM17 = ZEXT3264(auVar145);
        pauVar95 = (undefined1 (*) [32])(*pauVar95 + 0x10);
        pauVar101 = pauVar101 + 2;
        uVar105 = uVar103 + 7;
        uVar103 = uVar103 + 4;
      }
      if (uVar112 - uVar103 != 0 && (int)uVar103 <= (int)uVar112) {
        lVar104 = 0;
        do {
          auVar125 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + lVar104 * 4)));
          auVar128 = vfmadd231ps_avx512vl(auVar128,auVar125,*(undefined1 (*) [16])*pauVar101);
          pauVar101 = (undefined1 (*) [32])(*pauVar101 + 0x10);
          lVar104 = lVar104 + 1;
        } while (uVar112 - uVar103 != (int)lVar104);
      }
      auVar143 = vaddps_avx512vl(in_ZMM18._0_32_,auVar143);
      auVar144 = vaddps_avx512vl(in_ZMM17._0_32_,auVar144);
      auVar143 = vaddps_avx512vl(auVar143,auVar144);
      auVar125 = vextractf32x4_avx512vl(auVar143,1);
      in_ZMM16 = ZEXT1664(auVar125);
      auVar125 = vaddps_avx512vl(auVar125,auVar143._0_16_);
      auVar134._0_4_ = auVar125._0_4_ + auVar128._0_4_;
      auVar134._4_4_ = auVar125._4_4_ + auVar128._4_4_;
      auVar134._8_4_ = auVar125._8_4_ + auVar128._8_4_;
      auVar134._12_4_ = auVar125._12_4_ + auVar128._12_4_;
      switch(uVar7) {
      case 1:
        auVar134 = vmaxps_avx(auVar134,auVar188);
        break;
      case 2:
        auVar128 = vmaxps_avx(auVar134,auVar188);
        auVar125 = vminps_avx(auVar134,auVar188);
        uVar5 = *(this->super_InnerProduct).activation_params.data;
        auVar31._4_4_ = uVar5;
        auVar31._0_4_ = uVar5;
        auVar31._8_4_ = uVar5;
        auVar31._12_4_ = uVar5;
        auVar134 = vfmadd132ps_avx512vl(auVar125,auVar128,auVar31);
        break;
      case 3:
        puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
        uVar5 = *puVar10;
        auVar29._4_4_ = uVar5;
        auVar29._0_4_ = uVar5;
        auVar29._8_4_ = uVar5;
        auVar29._12_4_ = uVar5;
        auVar128 = vmaxps_avx512vl(auVar134,auVar29);
        uVar5 = puVar10[1];
        auVar30._4_4_ = uVar5;
        auVar30._0_4_ = uVar5;
        auVar30._8_4_ = uVar5;
        auVar30._12_4_ = uVar5;
        auVar134 = vminps_avx512vl(auVar128,auVar30);
        break;
      case 4:
        auVar27._8_4_ = 0x80000000;
        auVar27._0_8_ = 0x8000000080000000;
        auVar27._12_4_ = 0x80000000;
        auVar128 = vxorps_avx512vl(auVar134,auVar27);
        auVar128 = vminps_avx(auVar128,auVar202);
        auVar128 = vmaxps_avx(auVar128,auVar211);
        auVar125 = vfmadd231ps_fma(auVar217,auVar128,auVar223);
        auVar124 = vcvttps2dq_avx512vl(auVar125);
        auVar124 = vcvtdq2ps_avx512vl(auVar124);
        uVar16 = vcmpps_avx512vl(auVar125,auVar124,1);
        auVar125 = vsubps_avx512vl(auVar124,auVar227);
        bVar14 = (bool)((byte)uVar16 & 1);
        auVar135._0_4_ = (uint)bVar14 * auVar125._0_4_ | (uint)!bVar14 * auVar124._0_4_;
        bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar14 * auVar125._4_4_ | (uint)!bVar14 * auVar124._4_4_;
        bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar14 * auVar125._8_4_ | (uint)!bVar14 * auVar124._8_4_;
        bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar14 * auVar125._12_4_ | (uint)!bVar14 * auVar124._12_4_;
        in_ZMM16 = ZEXT1664(auVar135);
        auVar128 = vfmsub231ps_avx512vl(auVar128,auVar135,auVar230);
        auVar28._8_4_ = 0x395e8083;
        auVar28._0_8_ = 0x395e8083395e8083;
        auVar28._12_4_ = 0x395e8083;
        auVar128 = vfmsub231ps_avx512vl(auVar128,auVar135,auVar28);
        auVar234._0_4_ = auVar128._0_4_ * auVar128._0_4_;
        auVar234._4_4_ = auVar128._4_4_ * auVar128._4_4_;
        auVar234._8_4_ = auVar128._8_4_ * auVar128._8_4_;
        auVar234._12_4_ = auVar128._12_4_ * auVar128._12_4_;
        auVar125 = vfmadd213ps_avx512vl(auVar240,auVar128,auVar243);
        auVar125 = vfmadd213ps_avx512vl(auVar125,auVar128,auVar246);
        auVar125 = vfmadd213ps_avx512vl(auVar125,auVar128,auVar249);
        auVar125 = vfmadd213ps_avx512vl(auVar125,auVar128,auVar252);
        auVar125 = vfmadd213ps_avx512vl(auVar125,auVar128,auVar217);
        auVar128 = vfmadd213ps_avx512vl(auVar125,auVar234,auVar128);
        in_ZMM17 = ZEXT1664(auVar128);
        auVar125 = vaddps_avx512vl(auVar128,auVar227);
        auVar128 = vcvttps2dq_avx512vl(auVar135);
        auVar128 = vpslld_avx(auVar128,0x17);
        auVar128 = vpaddd_avx(auVar128,auVar256);
        auVar128 = vfmadd213ps_fma(auVar128,auVar125,auVar227);
        auVar134 = vdivps_avx(auVar227,auVar128);
        break;
      case 5:
        auVar128 = vminps_avx(auVar134,auVar202);
        auVar128 = vmaxps_avx(auVar128,auVar211);
        auVar125 = vfmadd213ps_avx512vl(auVar223,auVar128,auVar217);
        auVar124 = vcvttps2dq_avx512vl(auVar125);
        auVar124 = vcvtdq2ps_avx512vl(auVar124);
        uVar16 = vcmpps_avx512vl(auVar125,auVar124,1);
        auVar125 = vsubps_avx512vl(auVar124,auVar227);
        bVar14 = (bool)((byte)uVar16 & 1);
        auVar129._0_4_ = (uint)bVar14 * auVar125._0_4_ | (uint)!bVar14 * auVar124._0_4_;
        bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar14 * auVar125._4_4_ | (uint)!bVar14 * auVar124._4_4_;
        bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar14 * auVar125._8_4_ | (uint)!bVar14 * auVar124._8_4_;
        bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar14 * auVar125._12_4_ | (uint)!bVar14 * auVar124._12_4_;
        auVar128 = vfmsub231ps_avx512vl(auVar128,auVar129,auVar230);
        auVar128 = vfnmsub231ps_avx512vl(auVar128,auVar129,auVar258);
        auVar125 = vmulps_avx512vl(auVar128,auVar128);
        auVar124 = vfmadd213ps_avx512vl(auVar240,auVar128,auVar243);
        auVar124 = vfmadd213ps_avx512vl(auVar124,auVar128,auVar246);
        auVar124 = vfmadd213ps_avx512vl(auVar124,auVar128,auVar249);
        auVar124 = vfmadd213ps_avx512vl(auVar124,auVar128,auVar252);
        auVar124 = vfmadd213ps_avx512vl(auVar124,auVar128,auVar217);
        auVar128 = vfmadd213ps_avx512vl(auVar124,auVar125,auVar128);
        auVar128 = vaddps_avx512vl(auVar128,auVar227);
        auVar125 = vcvttps2dq_avx512vl(auVar129);
        auVar125 = vpslld_avx512vl(auVar125,0x17);
        auVar125 = vpaddd_avx512vl(auVar125,auVar256);
        auVar128 = vfmadd213ps_avx512vl(auVar125,auVar128,auVar227);
        uVar16 = vcmpps_avx512vl(auVar128,auVar188,2);
        auVar20._8_4_ = 0x800000;
        auVar20._0_8_ = 0x80000000800000;
        auVar20._12_4_ = 0x800000;
        auVar128 = vmaxps_avx512vl(auVar128,auVar20);
        auVar125 = vpsrld_avx512vl(auVar128,0x17);
        auVar124 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
        auVar21._8_4_ = 0x3f000000;
        auVar21._0_8_ = 0x3f0000003f000000;
        auVar21._12_4_ = 0x3f000000;
        auVar128 = vpternlogd_avx512vl(auVar128,auVar124,auVar21,0xea);
        auVar22._8_4_ = 0x3f3504f3;
        auVar22._0_8_ = 0x3f3504f33f3504f3;
        auVar22._12_4_ = 0x3f3504f3;
        uVar17 = vcmpps_avx512vl(auVar128,auVar22,1);
        auVar23._8_4_ = 0xbf800000;
        auVar23._0_8_ = 0xbf800000bf800000;
        auVar23._12_4_ = 0xbf800000;
        auVar124 = vaddps_avx512vl(auVar128,auVar23);
        auVar128 = vaddps_avx512vl(auVar124,auVar128);
        bVar14 = (bool)((byte)uVar17 & 1);
        auVar130._0_4_ = (uint)bVar14 * auVar128._0_4_ | (uint)!bVar14 * auVar124._0_4_;
        bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar14 * auVar128._4_4_ | (uint)!bVar14 * auVar124._4_4_;
        bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar14 * auVar128._8_4_ | (uint)!bVar14 * auVar124._8_4_;
        bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar14 * auVar128._12_4_ | (uint)!bVar14 * auVar124._12_4_;
        auVar128 = vmulps_avx512vl(auVar130,auVar130);
        auVar24._8_4_ = 0xbdebd1b8;
        auVar24._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar24._12_4_ = 0xbdebd1b8;
        auVar124 = vfmadd213ps_avx512vl(auVar116,auVar130,auVar24);
        auVar25._8_4_ = 0x3def251a;
        auVar25._0_8_ = 0x3def251a3def251a;
        auVar25._12_4_ = 0x3def251a;
        auVar124 = vfmadd213ps_avx512vl(auVar124,auVar130,auVar25);
        auVar124 = vfmadd213ps_avx512vl(auVar124,auVar130,auVar117);
        auVar124 = vfmadd213ps_avx512vl(auVar124,auVar130,auVar118);
        auVar124 = vfmadd213ps_avx512vl(auVar124,auVar130,auVar119);
        auVar124 = vfmadd213ps_avx512vl(auVar124,auVar130,auVar120);
        auVar124 = vfmadd213ps_avx512vl(auVar124,auVar130,auVar121);
        auVar124 = vfmadd213ps_avx512vl(auVar124,auVar130,auVar122);
        auVar126 = vmulps_avx512vl(auVar128,auVar130);
        auVar124 = vmulps_avx512vl(auVar126,auVar124);
        auVar26._8_4_ = 0xffffff82;
        auVar26._0_8_ = 0xffffff82ffffff82;
        auVar26._12_4_ = 0xffffff82;
        auVar125 = vpaddd_avx512vl(auVar125,auVar26);
        auVar125 = vcvtdq2ps_avx512vl(auVar125);
        auVar126 = vsubps_avx512vl(auVar125,auVar227);
        bVar14 = (bool)((byte)uVar17 & 1);
        auVar131._0_4_ = (uint)bVar14 * auVar126._0_4_ | (uint)!bVar14 * auVar125._0_4_;
        bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar14 * auVar126._4_4_ | (uint)!bVar14 * auVar125._4_4_;
        bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar14 * auVar126._8_4_ | (uint)!bVar14 * auVar125._8_4_;
        bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar14 * auVar126._12_4_ | (uint)!bVar14 * auVar125._12_4_;
        auVar125 = vfmadd231ps_avx512vl(auVar124,auVar131,auVar258);
        auVar128 = vfmsub231ps_avx512vl(auVar125,auVar217,auVar128);
        auVar128 = vsubps_avx512vl(auVar128,auVar130);
        auVar128 = vfnmadd231ps_avx512vl(auVar128,auVar230,auVar131);
        auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        bVar14 = (bool)((byte)uVar16 & 1);
        auVar132._0_4_ =
             (uint)bVar14 * auVar125._0_4_ | (uint)!bVar14 * (int)(auVar128._0_4_ + auVar128._0_4_);
        bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar132._4_4_ =
             (uint)bVar14 * auVar125._4_4_ | (uint)!bVar14 * (int)(auVar128._4_4_ + auVar128._4_4_);
        bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar132._8_4_ =
             (uint)bVar14 * auVar125._8_4_ | (uint)!bVar14 * (int)(auVar128._8_4_ + auVar128._8_4_);
        bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar132._12_4_ =
             (uint)bVar14 * auVar125._12_4_ |
             (uint)!bVar14 * (int)(auVar128._12_4_ + auVar128._12_4_);
        auVar128 = vminps_avx(auVar132,auVar202);
        auVar128 = vmaxps_avx(auVar128,auVar211);
        auVar125 = vfmadd213ps_avx512vl(auVar223,auVar128,auVar217);
        auVar124 = vcvttps2dq_avx512vl(auVar125);
        auVar124 = vcvtdq2ps_avx512vl(auVar124);
        uVar16 = vcmpps_avx512vl(auVar125,auVar124,1);
        auVar125 = vsubps_avx512vl(auVar124,auVar227);
        bVar14 = (bool)((byte)uVar16 & 1);
        auVar133._0_4_ = (uint)bVar14 * auVar125._0_4_ | (uint)!bVar14 * auVar124._0_4_;
        bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar14 * auVar125._4_4_ | (uint)!bVar14 * auVar124._4_4_;
        bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar14 * auVar125._8_4_ | (uint)!bVar14 * auVar124._8_4_;
        bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar14 * auVar125._12_4_ | (uint)!bVar14 * auVar124._12_4_;
        in_ZMM17 = ZEXT1664(auVar133);
        auVar128 = vfmsub231ps_avx512vl(auVar128,auVar133,auVar230);
        auVar128 = vfnmsub231ps_avx512vl(auVar128,auVar133,auVar258);
        auVar125 = vmulps_avx512vl(auVar128,auVar128);
        auVar124 = vfmadd213ps_avx512vl(auVar240,auVar128,auVar243);
        auVar124 = vfmadd213ps_avx512vl(auVar124,auVar128,auVar246);
        auVar124 = vfmadd213ps_avx512vl(auVar124,auVar128,auVar249);
        auVar124 = vfmadd213ps_avx512vl(auVar124,auVar128,auVar252);
        auVar124 = vfmadd213ps_avx512vl(auVar124,auVar128,auVar217);
        auVar128 = vfmadd213ps_avx512vl(auVar124,auVar125,auVar128);
        in_ZMM18 = ZEXT1664(auVar128);
        auVar128 = vaddps_avx512vl(auVar128,auVar227);
        auVar125 = vcvttps2dq_avx512vl(auVar133);
        auVar125 = vpslld_avx512vl(auVar125,0x17);
        auVar125 = vpaddd_avx512vl(auVar125,auVar256);
        auVar128 = vfmadd213ps_avx512vl(auVar125,auVar128,auVar227);
        in_ZMM16 = ZEXT1664(auVar128);
        auVar128 = vdivps_avx512vl(auVar123,auVar128);
        auVar134 = vfmsub231ps_fma(auVar134,auVar134,auVar128);
        break;
      case 6:
        puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
        uVar5 = *puVar10;
        auVar235._4_4_ = uVar5;
        auVar235._0_4_ = uVar5;
        auVar235._8_4_ = uVar5;
        auVar235._12_4_ = uVar5;
        uVar5 = puVar10[1];
        auVar19._4_4_ = uVar5;
        auVar19._0_4_ = uVar5;
        auVar19._8_4_ = uVar5;
        auVar19._12_4_ = uVar5;
        auVar128 = vfmadd213ps_avx512vl(auVar235,auVar134,auVar19);
        auVar128 = vmaxps_avx(auVar128,auVar188);
        auVar128 = vminps_avx(auVar128,auVar227);
        auVar134._0_4_ = auVar128._0_4_ * auVar134._0_4_;
        auVar134._4_4_ = auVar128._4_4_ * auVar134._4_4_;
        auVar134._8_4_ = auVar128._8_4_ * auVar134._8_4_;
        auVar134._12_4_ = auVar128._12_4_ * auVar134._12_4_;
      }
      *(undefined1 (*) [16])((long)top_blob->data + uVar97 * 0x10) = auVar134;
      uVar97 = uVar97 + 1;
    } while (uVar97 != uVar96);
  }
  else if (iVar94 == 8) {
    if ((int)uVar103 < 1) goto LAB_002b8f8b;
    uVar97 = 0;
    auVar149._8_4_ = 0x42b0c0a5;
    auVar149._0_8_ = 0x42b0c0a542b0c0a5;
    auVar149._12_4_ = 0x42b0c0a5;
    auVar149._16_4_ = 0x42b0c0a5;
    auVar149._20_4_ = 0x42b0c0a5;
    auVar149._24_4_ = 0x42b0c0a5;
    auVar149._28_4_ = 0x42b0c0a5;
    auVar150._8_4_ = 0xc2b0c0a5;
    auVar150._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar150._12_4_ = 0xc2b0c0a5;
    auVar150._16_4_ = 0xc2b0c0a5;
    auVar150._20_4_ = 0xc2b0c0a5;
    auVar150._24_4_ = 0xc2b0c0a5;
    auVar150._28_4_ = 0xc2b0c0a5;
    auVar151._8_4_ = 0x3f000000;
    auVar151._0_8_ = 0x3f0000003f000000;
    auVar151._12_4_ = 0x3f000000;
    auVar151._16_4_ = 0x3f000000;
    auVar151._20_4_ = 0x3f000000;
    auVar151._24_4_ = 0x3f000000;
    auVar151._28_4_ = 0x3f000000;
    auVar152._8_4_ = 0x3fb8aa3b;
    auVar152._0_8_ = 0x3fb8aa3b3fb8aa3b;
    auVar152._12_4_ = 0x3fb8aa3b;
    auVar152._16_4_ = 0x3fb8aa3b;
    auVar152._20_4_ = 0x3fb8aa3b;
    auVar152._24_4_ = 0x3fb8aa3b;
    auVar152._28_4_ = 0x3fb8aa3b;
    auVar153._8_4_ = 0x3f800000;
    auVar153._0_8_ = 0x3f8000003f800000;
    auVar153._12_4_ = 0x3f800000;
    auVar153._16_4_ = 0x3f800000;
    auVar153._20_4_ = 0x3f800000;
    auVar153._24_4_ = 0x3f800000;
    auVar153._28_4_ = 0x3f800000;
    auVar154._8_4_ = 0x3f318000;
    auVar154._0_8_ = 0x3f3180003f318000;
    auVar154._12_4_ = 0x3f318000;
    auVar154._16_4_ = 0x3f318000;
    auVar154._20_4_ = 0x3f318000;
    auVar154._24_4_ = 0x3f318000;
    auVar154._28_4_ = 0x3f318000;
    auVar155._8_4_ = 0x39506967;
    auVar155._0_8_ = 0x3950696739506967;
    auVar155._12_4_ = 0x39506967;
    auVar155._16_4_ = 0x39506967;
    auVar155._20_4_ = 0x39506967;
    auVar155._24_4_ = 0x39506967;
    auVar155._28_4_ = 0x39506967;
    auVar164._8_4_ = 0x3ab743ce;
    auVar164._0_8_ = 0x3ab743ce3ab743ce;
    auVar164._12_4_ = 0x3ab743ce;
    auVar164._16_4_ = 0x3ab743ce;
    auVar164._20_4_ = 0x3ab743ce;
    auVar164._24_4_ = 0x3ab743ce;
    auVar164._28_4_ = 0x3ab743ce;
    auVar156._8_4_ = 0x3c088908;
    auVar156._0_8_ = 0x3c0889083c088908;
    auVar156._12_4_ = 0x3c088908;
    auVar156._16_4_ = 0x3c088908;
    auVar156._20_4_ = 0x3c088908;
    auVar156._24_4_ = 0x3c088908;
    auVar156._28_4_ = 0x3c088908;
    auVar157._8_4_ = 0x3d2aa9c1;
    auVar157._0_8_ = 0x3d2aa9c13d2aa9c1;
    auVar157._12_4_ = 0x3d2aa9c1;
    auVar157._16_4_ = 0x3d2aa9c1;
    auVar157._20_4_ = 0x3d2aa9c1;
    auVar157._24_4_ = 0x3d2aa9c1;
    auVar157._28_4_ = 0x3d2aa9c1;
    auVar158._8_4_ = 0x3e2aaaaa;
    auVar158._0_8_ = 0x3e2aaaaa3e2aaaaa;
    auVar158._12_4_ = 0x3e2aaaaa;
    auVar158._16_4_ = 0x3e2aaaaa;
    auVar158._20_4_ = 0x3e2aaaaa;
    auVar158._24_4_ = 0x3e2aaaaa;
    auVar158._28_4_ = 0x3e2aaaaa;
    auVar159._8_4_ = 0x3f800000;
    auVar159._0_8_ = 0x3f8000003f800000;
    auVar159._12_4_ = 0x3f800000;
    auVar159._16_4_ = 0x3f800000;
    auVar159._20_4_ = 0x3f800000;
    auVar159._24_4_ = 0x3f800000;
    auVar159._28_4_ = 0x3f800000;
    auVar160._8_4_ = 0xb95e8083;
    auVar160._0_8_ = 0xb95e8083b95e8083;
    auVar160._12_4_ = 0xb95e8083;
    auVar160._16_4_ = 0xb95e8083;
    auVar160._20_4_ = 0xb95e8083;
    auVar160._24_4_ = 0xb95e8083;
    auVar160._28_4_ = 0xb95e8083;
    auVar143 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
    auVar144 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
    auVar145 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
    auVar146 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
    auVar147 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
    auVar148 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
    do {
      auVar239 = ZEXT1664(ZEXT816(0) << 0x40);
      if (pvVar9 != (void *)0x0) {
        auVar239 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar9 + uVar97 * 0x20));
      }
      pauVar101 = (undefined1 (*) [32])
                  ((long)(this->weight_data_tm).w * uVar97 * (this->weight_data_tm).elemsize +
                  (long)(this->weight_data_tm).data);
      auVar117 = in_ZMM17._0_16_;
      auVar116 = in_ZMM16._0_16_;
      auVar120 = in_ZMM20._0_16_;
      auVar119 = in_ZMM19._0_16_;
      auVar121 = in_ZMM23._0_16_;
      auVar118 = in_ZMM18._0_16_;
      pauVar95 = local_128;
      if ((int)uVar112 < 8) {
        auVar118 = vxorps_avx512vl(auVar118,auVar118);
        auVar162 = ZEXT1632(auVar118);
        auVar118 = vxorps_avx512vl(auVar121,auVar121);
        in_ZMM23 = ZEXT1664(auVar118);
        auVar118 = vxorps_avx512vl(auVar119,auVar119);
        auVar161 = ZEXT1632(auVar118);
        auVar118 = vxorps_avx512vl(auVar120,auVar120);
        in_ZMM20 = ZEXT1664(auVar118);
        auVar116 = vxorps_avx512vl(auVar116,auVar116);
        auVar209 = ZEXT1664(auVar116);
        auVar116 = vxorps_avx512vl(auVar117,auVar117);
        in_ZMM17 = ZEXT1664(auVar116);
        auVar261 = ZEXT864(0);
        uVar103 = 0;
      }
      else {
        auVar261 = ZEXT864(0);
        iVar93 = 7;
        auVar117 = vxorps_avx512vl(auVar117,auVar117);
        in_ZMM17 = ZEXT1664(auVar117);
        auVar116 = vxorps_avx512vl(auVar116,auVar116);
        auVar209 = ZEXT1664(auVar116);
        auVar116 = vxorps_avx512vl(auVar120,auVar120);
        in_ZMM20 = ZEXT1664(auVar116);
        auVar116 = vxorps_avx512vl(auVar119,auVar119);
        auVar233 = ZEXT1664(auVar116);
        auVar116 = vxorps_avx512vl(auVar121,auVar121);
        in_ZMM23 = ZEXT1664(auVar116);
        auVar116 = vxorps_avx512vl(auVar118,auVar118);
        auVar222 = ZEXT1664(auVar116);
        do {
          auVar161 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar95));
          auVar162 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 4)));
          auVar163 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 8)));
          auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 0xc)));
          auVar161 = vfmadd231ps_avx512vl(auVar239._0_32_,auVar161,*pauVar101);
          auVar239 = ZEXT3264(auVar161);
          auVar161 = vfmadd231ps_avx512vl(auVar261._0_32_,auVar162,pauVar101[1]);
          auVar261 = ZEXT3264(auVar161);
          auVar161 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar163,pauVar101[2]);
          in_ZMM17 = ZEXT3264(auVar161);
          auVar161 = vfmadd231ps_avx512vl(auVar209._0_32_,auVar172,pauVar101[3]);
          auVar209 = ZEXT3264(auVar161);
          auVar161 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 0x10)));
          auVar162 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 0x14)));
          auVar163 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 0x18)));
          auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 0x1c)));
          auVar161 = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar161,pauVar101[4]);
          in_ZMM20 = ZEXT3264(auVar161);
          auVar161 = vfmadd231ps_avx512vl(auVar233._0_32_,auVar162,pauVar101[5]);
          auVar233 = ZEXT3264(auVar161);
          auVar162 = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar163,pauVar101[6]);
          in_ZMM23 = ZEXT3264(auVar162);
          auVar162 = vfmadd231ps_avx512vl(auVar222._0_32_,auVar172,pauVar101[7]);
          auVar222 = ZEXT3264(auVar162);
          pauVar95 = pauVar95 + 1;
          pauVar101 = pauVar101 + 8;
          iVar93 = iVar93 + 8;
          uVar103 = uVar112 & 0xfffffff8;
        } while (iVar93 < (int)uVar112);
      }
      auVar172 = auVar261._0_32_;
      auVar163 = auVar209._0_32_;
      uVar105 = uVar103 | 3;
      while( true ) {
        auVar175 = auVar239._0_32_;
        if ((int)uVar112 <= (int)uVar105) break;
        auVar163 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar95));
        auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 4)));
        auVar173 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 8)));
        auVar174 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + 0xc)));
        auVar163 = vfmadd231ps_avx512vl(auVar175,auVar163,*pauVar101);
        auVar239 = ZEXT3264(auVar163);
        auVar172 = vfmadd231ps_avx512vl(auVar261._0_32_,auVar172,pauVar101[1]);
        auVar261 = ZEXT3264(auVar172);
        auVar163 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar173,pauVar101[2]);
        in_ZMM17 = ZEXT3264(auVar163);
        auVar163 = vfmadd231ps_avx512vl(auVar209._0_32_,auVar174,pauVar101[3]);
        auVar209 = ZEXT3264(auVar163);
        pauVar95 = (undefined1 (*) [32])(*pauVar95 + 0x10);
        pauVar101 = pauVar101 + 4;
        uVar105 = uVar103 + 7;
        uVar103 = uVar103 + 4;
      }
      if (uVar112 - uVar103 != 0 && (int)uVar103 <= (int)uVar112) {
        lVar104 = 0;
        do {
          auVar175 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar95 + lVar104 * 4)));
          auVar175 = vfmadd231ps_avx512vl(auVar239._0_32_,auVar175,*pauVar101);
          auVar239 = ZEXT3264(auVar175);
          pauVar101 = pauVar101 + 1;
          lVar104 = lVar104 + 1;
        } while (uVar112 - uVar103 != (int)lVar104);
      }
      auVar162 = vaddps_avx512vl(in_ZMM23._0_32_,auVar162);
      auVar161 = vaddps_avx512vl(auVar161,in_ZMM20._0_32_);
      in_ZMM19 = ZEXT3264(auVar161);
      auVar161 = vaddps_avx512vl(auVar162,auVar161);
      in_ZMM18 = ZEXT3264(auVar161);
      auVar162 = vaddps_avx512vl(auVar163,in_ZMM17._0_32_);
      in_ZMM16 = ZEXT3264(auVar162);
      auVar162 = vaddps_avx512vl(auVar162,auVar172);
      auVar162 = vaddps_avx512vl(auVar161,auVar162);
      auVar161._0_4_ = auVar162._0_4_ + auVar175._0_4_;
      auVar161._4_4_ = auVar162._4_4_ + auVar175._4_4_;
      auVar161._8_4_ = auVar162._8_4_ + auVar175._8_4_;
      auVar161._12_4_ = auVar162._12_4_ + auVar175._12_4_;
      auVar161._16_4_ = auVar162._16_4_ + auVar175._16_4_;
      auVar161._20_4_ = auVar162._20_4_ + auVar175._20_4_;
      auVar161._24_4_ = auVar162._24_4_ + auVar175._24_4_;
      auVar161._28_4_ = auVar162._28_4_ + auVar175._28_4_;
      if (5 < uVar7 - 1) goto LAB_002b86b2;
      auVar162 = ZEXT1632(ZEXT816(0));
      switch(uVar7) {
      case 1:
        auVar161 = vmaxps_avx(auVar161,ZEXT1632(ZEXT816(0)));
        break;
      case 2:
        auVar163 = vmaxps_avx(auVar161,auVar162);
        auVar161 = vminps_avx(auVar161,auVar162);
        uVar5 = *(this->super_InnerProduct).activation_params.data;
        auVar74._4_4_ = uVar5;
        auVar74._0_4_ = uVar5;
        auVar74._8_4_ = uVar5;
        auVar74._12_4_ = uVar5;
        auVar74._16_4_ = uVar5;
        auVar74._20_4_ = uVar5;
        auVar74._24_4_ = uVar5;
        auVar74._28_4_ = uVar5;
        auVar161 = vfmadd132ps_avx512vl(auVar161,auVar163,auVar74);
        break;
      case 3:
        puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
        uVar5 = *puVar10;
        auVar72._4_4_ = uVar5;
        auVar72._0_4_ = uVar5;
        auVar72._8_4_ = uVar5;
        auVar72._12_4_ = uVar5;
        auVar72._16_4_ = uVar5;
        auVar72._20_4_ = uVar5;
        auVar72._24_4_ = uVar5;
        auVar72._28_4_ = uVar5;
        auVar161 = vmaxps_avx512vl(auVar161,auVar72);
        uVar5 = puVar10[1];
        auVar73._4_4_ = uVar5;
        auVar73._0_4_ = uVar5;
        auVar73._8_4_ = uVar5;
        auVar73._12_4_ = uVar5;
        auVar73._16_4_ = uVar5;
        auVar73._20_4_ = uVar5;
        auVar73._24_4_ = uVar5;
        auVar73._28_4_ = uVar5;
        auVar161 = vminps_avx512vl(auVar161,auVar73);
        break;
      case 4:
        auVar70._8_4_ = 0x80000000;
        auVar70._0_8_ = 0x8000000080000000;
        auVar70._12_4_ = 0x80000000;
        auVar70._16_4_ = 0x80000000;
        auVar70._20_4_ = 0x80000000;
        auVar70._24_4_ = 0x80000000;
        auVar70._28_4_ = 0x80000000;
        auVar161 = vxorps_avx512vl(auVar161,auVar70);
        auVar161 = vminps_avx(auVar161,auVar149);
        auVar161 = vmaxps_avx(auVar161,auVar150);
        auVar116 = vfmadd231ps_fma(auVar151,auVar161,auVar152);
        auVar162 = vrndscaleps_avx512vl(ZEXT1632(auVar116),1);
        uVar16 = vcmpps_avx512vl(ZEXT1632(auVar116),auVar162,1);
        auVar163 = vsubps_avx512vl(auVar162,auVar153);
        bVar14 = (bool)((byte)uVar16 & 1);
        auVar181._0_4_ = (uint)bVar14 * auVar163._0_4_ | (uint)!bVar14 * auVar162._0_4_;
        bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar181._4_4_ = (uint)bVar14 * auVar163._4_4_ | (uint)!bVar14 * auVar162._4_4_;
        bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar181._8_4_ = (uint)bVar14 * auVar163._8_4_ | (uint)!bVar14 * auVar162._8_4_;
        bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar181._12_4_ = (uint)bVar14 * auVar163._12_4_ | (uint)!bVar14 * auVar162._12_4_;
        bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar181._16_4_ = (uint)bVar14 * auVar163._16_4_ | (uint)!bVar14 * auVar162._16_4_;
        bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar181._20_4_ = (uint)bVar14 * auVar163._20_4_ | (uint)!bVar14 * auVar162._20_4_;
        bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar181._24_4_ = (uint)bVar14 * auVar163._24_4_ | (uint)!bVar14 * auVar162._24_4_;
        bVar14 = SUB81(uVar16 >> 7,0);
        auVar181._28_4_ = (uint)bVar14 * auVar163._28_4_ | (uint)!bVar14 * auVar162._28_4_;
        in_ZMM16 = ZEXT3264(auVar181);
        auVar161 = vfmsub231ps_avx512vl(auVar161,auVar181,auVar154);
        auVar71._8_4_ = 0x395e8083;
        auVar71._0_8_ = 0x395e8083395e8083;
        auVar71._12_4_ = 0x395e8083;
        auVar71._16_4_ = 0x395e8083;
        auVar71._20_4_ = 0x395e8083;
        auVar71._24_4_ = 0x395e8083;
        auVar71._28_4_ = 0x395e8083;
        auVar161 = vfmsub231ps_avx512vl(auVar161,auVar181,auVar71);
        auVar238._0_4_ = auVar161._0_4_ * auVar161._0_4_;
        auVar238._4_4_ = auVar161._4_4_ * auVar161._4_4_;
        auVar238._8_4_ = auVar161._8_4_ * auVar161._8_4_;
        auVar238._12_4_ = auVar161._12_4_ * auVar161._12_4_;
        auVar238._16_4_ = auVar161._16_4_ * auVar161._16_4_;
        auVar238._20_4_ = auVar161._20_4_ * auVar161._20_4_;
        auVar238._24_4_ = auVar161._24_4_ * auVar161._24_4_;
        auVar238._28_4_ = 0;
        auVar162 = vfmadd213ps_avx512vl(auVar155,auVar161,auVar164);
        auVar162 = vfmadd213ps_avx512vl(auVar162,auVar161,auVar156);
        auVar162 = vfmadd213ps_avx512vl(auVar162,auVar161,auVar157);
        auVar162 = vfmadd213ps_avx512vl(auVar162,auVar161,auVar158);
        auVar162 = vfmadd213ps_avx512vl(auVar162,auVar161,auVar151);
        auVar161 = vfmadd213ps_avx512vl(auVar162,auVar238,auVar161);
        in_ZMM17 = ZEXT3264(auVar161);
        auVar162 = vaddps_avx512vl(auVar161,auVar153);
        auVar161 = vcvttps2dq_avx512vl(auVar181);
        auVar161 = vpslld_avx2(auVar161,0x17);
        auVar161 = vpaddd_avx2(auVar161,auVar159);
        auVar116 = vfmadd213ps_fma(auVar161,auVar162,auVar153);
        auVar161 = vdivps_avx(auVar153,ZEXT1632(auVar116));
        break;
      case 5:
        auVar163 = vminps_avx(auVar161,auVar149);
        auVar163 = vmaxps_avx(auVar163,auVar150);
        auVar172 = vfmadd213ps_avx512vl(auVar152,auVar163,auVar151);
        auVar175 = vrndscaleps_avx512vl(auVar172,1);
        uVar16 = vcmpps_avx512vl(auVar172,auVar175,1);
        auVar172 = vsubps_avx512vl(auVar175,auVar153);
        bVar14 = (bool)((byte)uVar16 & 1);
        auVar176._0_4_ = (uint)bVar14 * auVar172._0_4_ | (uint)!bVar14 * auVar175._0_4_;
        bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar176._4_4_ = (uint)bVar14 * auVar172._4_4_ | (uint)!bVar14 * auVar175._4_4_;
        bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar176._8_4_ = (uint)bVar14 * auVar172._8_4_ | (uint)!bVar14 * auVar175._8_4_;
        bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar176._12_4_ = (uint)bVar14 * auVar172._12_4_ | (uint)!bVar14 * auVar175._12_4_;
        bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar176._16_4_ = (uint)bVar14 * auVar172._16_4_ | (uint)!bVar14 * auVar175._16_4_;
        bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar176._20_4_ = (uint)bVar14 * auVar172._20_4_ | (uint)!bVar14 * auVar175._20_4_;
        bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar176._24_4_ = (uint)bVar14 * auVar172._24_4_ | (uint)!bVar14 * auVar175._24_4_;
        bVar14 = SUB81(uVar16 >> 7,0);
        auVar176._28_4_ = (uint)bVar14 * auVar172._28_4_ | (uint)!bVar14 * auVar175._28_4_;
        auVar163 = vfmsub231ps_avx512vl(auVar163,auVar176,auVar154);
        auVar163 = vfnmsub231ps_avx512vl(auVar163,auVar176,auVar160);
        auVar172 = vmulps_avx512vl(auVar163,auVar163);
        auVar175 = vfmadd213ps_avx512vl(auVar155,auVar163,auVar164);
        auVar175 = vfmadd213ps_avx512vl(auVar175,auVar163,auVar156);
        auVar175 = vfmadd213ps_avx512vl(auVar175,auVar163,auVar157);
        auVar175 = vfmadd213ps_avx512vl(auVar175,auVar163,auVar158);
        auVar175 = vfmadd213ps_avx512vl(auVar175,auVar163,auVar151);
        auVar163 = vfmadd213ps_avx512vl(auVar175,auVar172,auVar163);
        auVar163 = vaddps_avx512vl(auVar163,auVar153);
        auVar172 = vcvttps2dq_avx512vl(auVar176);
        auVar172 = vpslld_avx512vl(auVar172,0x17);
        auVar172 = vpaddd_avx512vl(auVar172,auVar159);
        auVar163 = vfmadd213ps_avx512vl(auVar172,auVar163,auVar153);
        uVar16 = vcmpps_avx512vl(auVar163,auVar162,2);
        auVar162._8_4_ = 0x800000;
        auVar162._0_8_ = 0x80000000800000;
        auVar162._12_4_ = 0x800000;
        auVar162._16_4_ = 0x800000;
        auVar162._20_4_ = 0x800000;
        auVar162._24_4_ = 0x800000;
        auVar162._28_4_ = 0x800000;
        auVar162 = vmaxps_avx512vl(auVar163,auVar162);
        auVar163 = vpsrld_avx512vl(auVar162,0x17);
        auVar172 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
        auVar175._8_4_ = 0x3f000000;
        auVar175._0_8_ = 0x3f0000003f000000;
        auVar175._12_4_ = 0x3f000000;
        auVar175._16_4_ = 0x3f000000;
        auVar175._20_4_ = 0x3f000000;
        auVar175._24_4_ = 0x3f000000;
        auVar175._28_4_ = 0x3f000000;
        auVar162 = vpternlogd_avx512vl(auVar162,auVar172,auVar175,0xea);
        auVar173._8_4_ = 0x3f3504f3;
        auVar173._0_8_ = 0x3f3504f33f3504f3;
        auVar173._12_4_ = 0x3f3504f3;
        auVar173._16_4_ = 0x3f3504f3;
        auVar173._20_4_ = 0x3f3504f3;
        auVar173._24_4_ = 0x3f3504f3;
        auVar173._28_4_ = 0x3f3504f3;
        uVar17 = vcmpps_avx512vl(auVar162,auVar173,1);
        auVar172 = vaddps_avx512vl(auVar162,auVar143);
        auVar162 = vaddps_avx512vl(auVar172,auVar162);
        bVar14 = (bool)((byte)uVar17 & 1);
        auVar177._0_4_ = (uint)bVar14 * auVar162._0_4_ | (uint)!bVar14 * auVar172._0_4_;
        bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar177._4_4_ = (uint)bVar14 * auVar162._4_4_ | (uint)!bVar14 * auVar172._4_4_;
        bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar177._8_4_ = (uint)bVar14 * auVar162._8_4_ | (uint)!bVar14 * auVar172._8_4_;
        bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar177._12_4_ = (uint)bVar14 * auVar162._12_4_ | (uint)!bVar14 * auVar172._12_4_;
        bVar14 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar177._16_4_ = (uint)bVar14 * auVar162._16_4_ | (uint)!bVar14 * auVar172._16_4_;
        bVar14 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar177._20_4_ = (uint)bVar14 * auVar162._20_4_ | (uint)!bVar14 * auVar172._20_4_;
        bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar177._24_4_ = (uint)bVar14 * auVar162._24_4_ | (uint)!bVar14 * auVar172._24_4_;
        bVar14 = SUB81(uVar17 >> 7,0);
        auVar177._28_4_ = (uint)bVar14 * auVar162._28_4_ | (uint)!bVar14 * auVar172._28_4_;
        auVar162 = vmulps_avx512vl(auVar177,auVar177);
        auVar172 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar174._8_4_ = 0xbdebd1b8;
        auVar174._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar174._12_4_ = 0xbdebd1b8;
        auVar174._16_4_ = 0xbdebd1b8;
        auVar174._20_4_ = 0xbdebd1b8;
        auVar174._24_4_ = 0xbdebd1b8;
        auVar174._28_4_ = 0xbdebd1b8;
        auVar172 = vfmadd213ps_avx512vl(auVar172,auVar177,auVar174);
        auVar66._8_4_ = 0x3def251a;
        auVar66._0_8_ = 0x3def251a3def251a;
        auVar66._12_4_ = 0x3def251a;
        auVar66._16_4_ = 0x3def251a;
        auVar66._20_4_ = 0x3def251a;
        auVar66._24_4_ = 0x3def251a;
        auVar66._28_4_ = 0x3def251a;
        auVar172 = vfmadd213ps_avx512vl(auVar172,auVar177,auVar66);
        auVar67._8_4_ = 0xbdfe5d4f;
        auVar67._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar67._12_4_ = 0xbdfe5d4f;
        auVar67._16_4_ = 0xbdfe5d4f;
        auVar67._20_4_ = 0xbdfe5d4f;
        auVar67._24_4_ = 0xbdfe5d4f;
        auVar67._28_4_ = 0xbdfe5d4f;
        auVar172 = vfmadd213ps_avx512vl(auVar172,auVar177,auVar67);
        auVar68._8_4_ = 0x3e11e9bf;
        auVar68._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar68._12_4_ = 0x3e11e9bf;
        auVar68._16_4_ = 0x3e11e9bf;
        auVar68._20_4_ = 0x3e11e9bf;
        auVar68._24_4_ = 0x3e11e9bf;
        auVar68._28_4_ = 0x3e11e9bf;
        auVar172 = vfmadd213ps_avx512vl(auVar172,auVar177,auVar68);
        auVar172 = vfmadd213ps_avx512vl(auVar172,auVar177,auVar144);
        auVar172 = vfmadd213ps_avx512vl(auVar172,auVar177,auVar145);
        auVar172 = vfmadd213ps_avx512vl(auVar172,auVar177,auVar146);
        auVar172 = vfmadd213ps_avx512vl(auVar172,auVar177,auVar147);
        auVar175 = vmulps_avx512vl(auVar162,auVar177);
        in_ZMM19 = ZEXT3264(auVar175);
        auVar172 = vmulps_avx512vl(auVar175,auVar172);
        auVar69._8_4_ = 0xffffff82;
        auVar69._0_8_ = 0xffffff82ffffff82;
        auVar69._12_4_ = 0xffffff82;
        auVar69._16_4_ = 0xffffff82;
        auVar69._20_4_ = 0xffffff82;
        auVar69._24_4_ = 0xffffff82;
        auVar69._28_4_ = 0xffffff82;
        auVar163 = vpaddd_avx512vl(auVar163,auVar69);
        auVar163 = vcvtdq2ps_avx512vl(auVar163);
        auVar175 = vsubps_avx512vl(auVar163,auVar153);
        bVar14 = (bool)((byte)uVar17 & 1);
        auVar178._0_4_ = (uint)bVar14 * auVar175._0_4_ | (uint)!bVar14 * auVar163._0_4_;
        bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar178._4_4_ = (uint)bVar14 * auVar175._4_4_ | (uint)!bVar14 * auVar163._4_4_;
        bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar178._8_4_ = (uint)bVar14 * auVar175._8_4_ | (uint)!bVar14 * auVar163._8_4_;
        bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar178._12_4_ = (uint)bVar14 * auVar175._12_4_ | (uint)!bVar14 * auVar163._12_4_;
        bVar14 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar178._16_4_ = (uint)bVar14 * auVar175._16_4_ | (uint)!bVar14 * auVar163._16_4_;
        bVar14 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar178._20_4_ = (uint)bVar14 * auVar175._20_4_ | (uint)!bVar14 * auVar163._20_4_;
        bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar178._24_4_ = (uint)bVar14 * auVar175._24_4_ | (uint)!bVar14 * auVar163._24_4_;
        bVar14 = SUB81(uVar17 >> 7,0);
        auVar178._28_4_ = (uint)bVar14 * auVar175._28_4_ | (uint)!bVar14 * auVar163._28_4_;
        auVar163 = vfmadd231ps_avx512vl(auVar172,auVar178,auVar160);
        auVar162 = vfmsub231ps_avx512vl(auVar163,auVar151,auVar162);
        auVar162 = vsubps_avx512vl(auVar162,auVar177);
        auVar162 = vfmsub231ps_avx512vl(auVar162,auVar154,auVar178);
        auVar162 = vmulps_avx512vl(auVar162,auVar148);
        auVar163 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        bVar14 = (bool)((byte)uVar16 & 1);
        auVar179._0_4_ = (uint)bVar14 * auVar163._0_4_ | (uint)!bVar14 * auVar162._0_4_;
        bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar179._4_4_ = (uint)bVar14 * auVar163._4_4_ | (uint)!bVar14 * auVar162._4_4_;
        bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar179._8_4_ = (uint)bVar14 * auVar163._8_4_ | (uint)!bVar14 * auVar162._8_4_;
        bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar179._12_4_ = (uint)bVar14 * auVar163._12_4_ | (uint)!bVar14 * auVar162._12_4_;
        bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar179._16_4_ = (uint)bVar14 * auVar163._16_4_ | (uint)!bVar14 * auVar162._16_4_;
        bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar179._20_4_ = (uint)bVar14 * auVar163._20_4_ | (uint)!bVar14 * auVar162._20_4_;
        bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar179._24_4_ = (uint)bVar14 * auVar163._24_4_ | (uint)!bVar14 * auVar162._24_4_;
        bVar14 = SUB81(uVar16 >> 7,0);
        auVar179._28_4_ = (uint)bVar14 * auVar163._28_4_ | (uint)!bVar14 * auVar162._28_4_;
        auVar162 = vminps_avx(auVar179,auVar149);
        auVar162 = vmaxps_avx(auVar162,auVar150);
        auVar163 = vfmadd213ps_avx512vl(auVar152,auVar162,auVar151);
        auVar172 = vrndscaleps_avx512vl(auVar163,1);
        uVar16 = vcmpps_avx512vl(auVar163,auVar172,1);
        auVar163 = vsubps_avx512vl(auVar172,auVar153);
        bVar14 = (bool)((byte)uVar16 & 1);
        auVar180._0_4_ = (uint)bVar14 * auVar163._0_4_ | (uint)!bVar14 * auVar172._0_4_;
        bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar180._4_4_ = (uint)bVar14 * auVar163._4_4_ | (uint)!bVar14 * auVar172._4_4_;
        bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar180._8_4_ = (uint)bVar14 * auVar163._8_4_ | (uint)!bVar14 * auVar172._8_4_;
        bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar180._12_4_ = (uint)bVar14 * auVar163._12_4_ | (uint)!bVar14 * auVar172._12_4_;
        bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar180._16_4_ = (uint)bVar14 * auVar163._16_4_ | (uint)!bVar14 * auVar172._16_4_;
        bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar180._20_4_ = (uint)bVar14 * auVar163._20_4_ | (uint)!bVar14 * auVar172._20_4_;
        bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar180._24_4_ = (uint)bVar14 * auVar163._24_4_ | (uint)!bVar14 * auVar172._24_4_;
        bVar14 = SUB81(uVar16 >> 7,0);
        auVar180._28_4_ = (uint)bVar14 * auVar163._28_4_ | (uint)!bVar14 * auVar172._28_4_;
        in_ZMM17 = ZEXT3264(auVar180);
        auVar162 = vfmsub231ps_avx512vl(auVar162,auVar180,auVar154);
        auVar162 = vfnmsub231ps_avx512vl(auVar162,auVar180,auVar160);
        auVar163 = vmulps_avx512vl(auVar162,auVar162);
        auVar172 = vfmadd213ps_avx512vl(auVar155,auVar162,auVar164);
        auVar172 = vfmadd213ps_avx512vl(auVar172,auVar162,auVar156);
        auVar172 = vfmadd213ps_avx512vl(auVar172,auVar162,auVar157);
        auVar172 = vfmadd213ps_avx512vl(auVar172,auVar162,auVar158);
        auVar172 = vfmadd213ps_avx512vl(auVar172,auVar162,auVar151);
        auVar162 = vfmadd213ps_avx512vl(auVar172,auVar163,auVar162);
        in_ZMM18 = ZEXT3264(auVar162);
        auVar162 = vaddps_avx512vl(auVar162,auVar153);
        auVar163 = vcvttps2dq_avx512vl(auVar180);
        auVar163 = vpslld_avx512vl(auVar163,0x17);
        auVar163 = vpaddd_avx512vl(auVar163,auVar159);
        auVar162 = vfmadd213ps_avx512vl(auVar163,auVar162,auVar153);
        in_ZMM16 = ZEXT3264(auVar162);
        auVar162 = vdivps_avx512vl(auVar153,auVar162);
        auVar162 = vfnmadd213ps_avx512vl(auVar162,auVar148,auVar143);
        auVar142 = auVar162._0_28_;
        goto LAB_002b86ae;
      case 6:
        puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
        uVar5 = *puVar10;
        auVar172._4_4_ = uVar5;
        auVar172._0_4_ = uVar5;
        auVar172._8_4_ = uVar5;
        auVar172._12_4_ = uVar5;
        auVar172._16_4_ = uVar5;
        auVar172._20_4_ = uVar5;
        auVar172._24_4_ = uVar5;
        auVar172._28_4_ = uVar5;
        uVar5 = puVar10[1];
        auVar163._4_4_ = uVar5;
        auVar163._0_4_ = uVar5;
        auVar163._8_4_ = uVar5;
        auVar163._12_4_ = uVar5;
        auVar163._16_4_ = uVar5;
        auVar163._20_4_ = uVar5;
        auVar163._24_4_ = uVar5;
        auVar163._28_4_ = uVar5;
        auVar163 = vfmadd213ps_avx512vl(auVar172,auVar161,auVar163);
        auVar162 = vmaxps_avx(auVar163,auVar162);
        auVar162 = vminps_avx(auVar162,auVar153);
        auVar142 = auVar162._0_28_;
LAB_002b86ae:
        auVar161._4_4_ = auVar142._4_4_ * auVar161._4_4_;
        auVar161._0_4_ = auVar142._0_4_ * auVar161._0_4_;
        auVar161._8_4_ = auVar142._8_4_ * auVar161._8_4_;
        auVar161._12_4_ = auVar142._12_4_ * auVar161._12_4_;
        auVar161._16_4_ = auVar142._16_4_ * auVar161._16_4_;
        auVar161._20_4_ = auVar142._20_4_ * auVar161._20_4_;
        auVar161._24_4_ = auVar142._24_4_ * auVar161._24_4_;
      }
LAB_002b86b2:
      *(undefined1 (*) [32])((long)top_blob->data + uVar97 * 0x20) = auVar161;
      uVar97 = uVar97 + 1;
    } while (uVar97 != uVar96);
  }
  else {
    if ((iVar94 != 0x10) || ((int)uVar103 < 1)) goto LAB_002b8f8b;
    auVar239 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar261 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar239);
    auVar209 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar239);
    auVar222 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
    auVar233 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar239);
    uVar97 = 0;
    auVar116 = vxorps_avx512vl(auVar116,auVar116);
    auVar248 = ZEXT1664(auVar116);
    auVar242 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar245 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
    do {
      auVar116 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
      auVar260 = ZEXT1664(auVar116);
      if (pvVar9 != (void *)0x0) {
        auVar260 = *(undefined1 (*) [64])((long)pvVar9 + uVar97 * 0x40);
      }
      pauVar102 = (undefined1 (*) [64])
                  ((long)(this->weight_data_tm).w * uVar97 * (this->weight_data_tm).elemsize +
                  (long)(this->weight_data_tm).data);
      auVar117 = in_ZMM18._0_16_;
      auVar122 = in_ZMM23._0_16_;
      auVar120 = in_ZMM21._0_16_;
      auVar121 = in_ZMM22._0_16_;
      auVar118 = in_ZMM19._0_16_;
      auVar119 = in_ZMM20._0_16_;
      auVar116 = in_ZMM17._0_16_;
      pauVar101 = local_128;
      if ((int)uVar112 < 8) {
        auVar117 = vxorps_avx512vl(auVar117,auVar117);
        auVar263 = ZEXT1664(auVar117);
        auVar117 = vxorps_avx512vl(auVar122,auVar122);
        in_ZMM23 = ZEXT1664(auVar117);
        auVar117 = vxorps_avx512vl(auVar120,auVar120);
        auVar265 = ZEXT1664(auVar117);
        auVar117 = vxorps_avx512vl(auVar121,auVar121);
        in_ZMM22 = ZEXT1664(auVar117);
        auVar117 = vxorps_avx512vl(auVar118,auVar118);
        auVar264 = ZEXT1664(auVar117);
        auVar117 = vxorps_avx512vl(auVar119,auVar119);
        in_ZMM20 = ZEXT1664(auVar117);
        auVar116 = vxorps_avx512vl(auVar116,auVar116);
        auVar262 = ZEXT1664(auVar116);
        uVar103 = 0;
      }
      else {
        auVar116 = vxorps_avx512vl(auVar116,auVar116);
        auVar262 = ZEXT1664(auVar116);
        iVar93 = 7;
        auVar116 = vxorps_avx512vl(auVar119,auVar119);
        in_ZMM20 = ZEXT1664(auVar116);
        auVar116 = vxorps_avx512vl(auVar118,auVar118);
        auVar264 = ZEXT1664(auVar116);
        auVar116 = vxorps_avx512vl(auVar121,auVar121);
        in_ZMM22 = ZEXT1664(auVar116);
        auVar116 = vxorps_avx512vl(auVar120,auVar120);
        auVar265 = ZEXT1664(auVar116);
        auVar116 = vxorps_avx512vl(auVar122,auVar122);
        in_ZMM23 = ZEXT1664(auVar116);
        auVar116 = vxorps_avx512vl(auVar117,auVar117);
        auVar263 = ZEXT1664(auVar116);
        do {
          auVar182 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar101));
          auVar183 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar101 + 4)));
          auVar184 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar101 + 8)));
          auVar185 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar101 + 0xc)));
          auVar260 = vfmadd231ps_avx512f(auVar260,auVar182,*pauVar102);
          auVar262 = vfmadd231ps_avx512f(auVar262,auVar183,pauVar102[1]);
          in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar184,pauVar102[2]);
          auVar264 = vfmadd231ps_avx512f(auVar264,auVar185,pauVar102[3]);
          auVar182 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar101 + 0x10)));
          auVar183 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar101 + 0x14)));
          auVar184 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar101 + 0x18)));
          auVar185 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar101 + 0x1c)));
          in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar182,pauVar102[4]);
          auVar265 = vfmadd231ps_avx512f(auVar265,auVar183,pauVar102[5]);
          in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar184,pauVar102[6]);
          auVar263 = vfmadd231ps_avx512f(auVar263,auVar185,pauVar102[7]);
          pauVar101 = pauVar101 + 1;
          pauVar102 = pauVar102 + 8;
          iVar93 = iVar93 + 8;
          uVar103 = uVar112 & 0xfffffff8;
        } while (iVar93 < (int)uVar112);
      }
      uVar105 = uVar103 | 3;
      while ((int)uVar105 < (int)uVar112) {
        auVar182 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar101));
        auVar183 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar101 + 4)));
        auVar184 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar101 + 8)));
        auVar185 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar101 + 0xc)));
        auVar260 = vfmadd231ps_avx512f(auVar260,auVar182,*pauVar102);
        auVar262 = vfmadd231ps_avx512f(auVar262,auVar183,pauVar102[1]);
        in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar184,pauVar102[2]);
        auVar264 = vfmadd231ps_avx512f(auVar264,auVar185,pauVar102[3]);
        pauVar101 = (undefined1 (*) [32])(*pauVar101 + 0x10);
        pauVar102 = pauVar102 + 4;
        uVar105 = uVar103 + 7;
        uVar103 = uVar103 + 4;
      }
      if (uVar112 - uVar103 != 0 && (int)uVar103 <= (int)uVar112) {
        lVar104 = 0;
        do {
          auVar182 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar101 + lVar104 * 4)));
          auVar260 = vfmadd231ps_avx512f(auVar260,auVar182,*pauVar102);
          pauVar102 = pauVar102 + 1;
          lVar104 = lVar104 + 1;
        } while (uVar112 - uVar103 != (int)lVar104);
      }
      auVar263 = vaddps_avx512f(in_ZMM23,auVar263);
      in_ZMM21 = vaddps_avx512f(auVar265,in_ZMM22);
      in_ZMM18 = vaddps_avx512f(auVar263,in_ZMM21);
      in_ZMM19 = vaddps_avx512f(auVar264,in_ZMM20);
      auVar262 = vaddps_avx512f(in_ZMM19,auVar262);
      in_ZMM17 = vaddps_avx512f(in_ZMM18,auVar262);
      auVar260 = vaddps_avx512f(in_ZMM17,auVar260);
      in_ZMM16 = auVar260;
      switch(uVar7) {
      case 1:
        in_ZMM16 = vmaxps_avx512f(auVar260,auVar248);
        break;
      case 2:
        uVar16 = vcmpps_avx512f(auVar260,auVar248,1);
        uVar5 = *(this->super_InnerProduct).activation_params.data;
        auVar184._4_4_ = uVar5;
        auVar184._0_4_ = uVar5;
        auVar184._8_4_ = uVar5;
        auVar184._12_4_ = uVar5;
        auVar184._16_4_ = uVar5;
        auVar184._20_4_ = uVar5;
        auVar184._24_4_ = uVar5;
        auVar184._28_4_ = uVar5;
        auVar184._32_4_ = uVar5;
        auVar184._36_4_ = uVar5;
        auVar184._40_4_ = uVar5;
        auVar184._44_4_ = uVar5;
        auVar184._48_4_ = uVar5;
        auVar184._52_4_ = uVar5;
        auVar184._56_4_ = uVar5;
        auVar184._60_4_ = uVar5;
        auVar262 = vmulps_avx512f(auVar260,auVar184);
        bVar14 = (bool)((byte)uVar16 & 1);
        in_ZMM16._0_4_ = (uint)bVar14 * auVar262._0_4_ | (uint)!bVar14 * auVar260._0_4_;
        bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
        in_ZMM16._4_4_ = (uint)bVar14 * auVar262._4_4_ | (uint)!bVar14 * auVar260._4_4_;
        bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
        in_ZMM16._8_4_ = (uint)bVar14 * auVar262._8_4_ | (uint)!bVar14 * auVar260._8_4_;
        bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
        in_ZMM16._12_4_ = (uint)bVar14 * auVar262._12_4_ | (uint)!bVar14 * auVar260._12_4_;
        bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
        in_ZMM16._16_4_ = (uint)bVar14 * auVar262._16_4_ | (uint)!bVar14 * auVar260._16_4_;
        bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
        in_ZMM16._20_4_ = (uint)bVar14 * auVar262._20_4_ | (uint)!bVar14 * auVar260._20_4_;
        bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
        in_ZMM16._24_4_ = (uint)bVar14 * auVar262._24_4_ | (uint)!bVar14 * auVar260._24_4_;
        bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
        in_ZMM16._28_4_ = (uint)bVar14 * auVar262._28_4_ | (uint)!bVar14 * auVar260._28_4_;
        bVar14 = (bool)((byte)(uVar16 >> 8) & 1);
        in_ZMM16._32_4_ = (uint)bVar14 * auVar262._32_4_ | (uint)!bVar14 * auVar260._32_4_;
        bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
        in_ZMM16._36_4_ = (uint)bVar14 * auVar262._36_4_ | (uint)!bVar14 * auVar260._36_4_;
        bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
        in_ZMM16._40_4_ = (uint)bVar14 * auVar262._40_4_ | (uint)!bVar14 * auVar260._40_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
        in_ZMM16._44_4_ = (uint)bVar14 * auVar262._44_4_ | (uint)!bVar14 * auVar260._44_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
        in_ZMM16._48_4_ = (uint)bVar14 * auVar262._48_4_ | (uint)!bVar14 * auVar260._48_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
        in_ZMM16._52_4_ = (uint)bVar14 * auVar262._52_4_ | (uint)!bVar14 * auVar260._52_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
        in_ZMM16._56_4_ = (uint)bVar14 * auVar262._56_4_ | (uint)!bVar14 * auVar260._56_4_;
        bVar14 = SUB81(uVar16 >> 0xf,0);
        in_ZMM16._60_4_ = (uint)bVar14 * auVar262._60_4_ | (uint)!bVar14 * auVar260._60_4_;
        break;
      case 3:
        puVar10 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
        uVar5 = *puVar10;
        auVar263._4_4_ = uVar5;
        auVar263._0_4_ = uVar5;
        auVar263._8_4_ = uVar5;
        auVar263._12_4_ = uVar5;
        auVar263._16_4_ = uVar5;
        auVar263._20_4_ = uVar5;
        auVar263._24_4_ = uVar5;
        auVar263._28_4_ = uVar5;
        auVar263._32_4_ = uVar5;
        auVar263._36_4_ = uVar5;
        auVar263._40_4_ = uVar5;
        auVar263._44_4_ = uVar5;
        auVar263._48_4_ = uVar5;
        auVar263._52_4_ = uVar5;
        auVar263._56_4_ = uVar5;
        auVar263._60_4_ = uVar5;
        auVar262 = vmaxps_avx512f(auVar260,auVar263);
        uVar5 = puVar10[1];
        auVar260._4_4_ = uVar5;
        auVar260._0_4_ = uVar5;
        auVar260._8_4_ = uVar5;
        auVar260._12_4_ = uVar5;
        auVar260._16_4_ = uVar5;
        auVar260._20_4_ = uVar5;
        auVar260._24_4_ = uVar5;
        auVar260._28_4_ = uVar5;
        auVar260._32_4_ = uVar5;
        auVar260._36_4_ = uVar5;
        auVar260._40_4_ = uVar5;
        auVar260._44_4_ = uVar5;
        auVar260._48_4_ = uVar5;
        auVar260._52_4_ = uVar5;
        auVar260._56_4_ = uVar5;
        auVar260._60_4_ = uVar5;
        in_ZMM16 = vminps_avx512f(auVar262,auVar260);
        break;
      case 4:
        auVar260 = vxorps_avx512dq(auVar260,auVar239);
        auVar260 = vminps_avx512f(auVar260,(undefined1  [64])afVar82);
        auVar260 = vmaxps_avx512f(auVar260,(undefined1  [64])afVar83);
        auVar262 = vfmadd213ps_avx512f((undefined1  [64])afVar84,auVar260,(undefined1  [64])afVar90)
        ;
        auVar264 = vrndscaleps_avx512f(auVar262,1);
        uVar16 = vcmpps_avx512f(auVar262,auVar264,1);
        auVar262 = vsubps_avx512f(auVar264,(undefined1  [64])afVar81);
        bVar14 = (bool)((byte)uVar16 & 1);
        in_ZMM18._0_4_ = (uint)bVar14 * auVar262._0_4_ | (uint)!bVar14 * auVar264._0_4_;
        bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
        in_ZMM18._4_4_ = (uint)bVar14 * auVar262._4_4_ | (uint)!bVar14 * auVar264._4_4_;
        bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
        in_ZMM18._8_4_ = (uint)bVar14 * auVar262._8_4_ | (uint)!bVar14 * auVar264._8_4_;
        bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
        in_ZMM18._12_4_ = (uint)bVar14 * auVar262._12_4_ | (uint)!bVar14 * auVar264._12_4_;
        bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
        in_ZMM18._16_4_ = (uint)bVar14 * auVar262._16_4_ | (uint)!bVar14 * auVar264._16_4_;
        bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
        in_ZMM18._20_4_ = (uint)bVar14 * auVar262._20_4_ | (uint)!bVar14 * auVar264._20_4_;
        bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
        in_ZMM18._24_4_ = (uint)bVar14 * auVar262._24_4_ | (uint)!bVar14 * auVar264._24_4_;
        bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
        in_ZMM18._28_4_ = (uint)bVar14 * auVar262._28_4_ | (uint)!bVar14 * auVar264._28_4_;
        bVar14 = (bool)((byte)(uVar16 >> 8) & 1);
        in_ZMM18._32_4_ = (uint)bVar14 * auVar262._32_4_ | (uint)!bVar14 * auVar264._32_4_;
        bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
        in_ZMM18._36_4_ = (uint)bVar14 * auVar262._36_4_ | (uint)!bVar14 * auVar264._36_4_;
        bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
        in_ZMM18._40_4_ = (uint)bVar14 * auVar262._40_4_ | (uint)!bVar14 * auVar264._40_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
        in_ZMM18._44_4_ = (uint)bVar14 * auVar262._44_4_ | (uint)!bVar14 * auVar264._44_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
        in_ZMM18._48_4_ = (uint)bVar14 * auVar262._48_4_ | (uint)!bVar14 * auVar264._48_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
        in_ZMM18._52_4_ = (uint)bVar14 * auVar262._52_4_ | (uint)!bVar14 * auVar264._52_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
        in_ZMM18._56_4_ = (uint)bVar14 * auVar262._56_4_ | (uint)!bVar14 * auVar264._56_4_;
        bVar14 = SUB81(uVar16 >> 0xf,0);
        in_ZMM18._60_4_ = (uint)bVar14 * auVar262._60_4_ | (uint)!bVar14 * auVar264._60_4_;
        auVar260 = vfmadd231ps_avx512f(auVar260,in_ZMM18,auVar261);
        auVar260 = vfmadd231ps_avx512f(auVar260,in_ZMM18,auVar209);
        auVar262 = vmulps_avx512f(auVar260,auVar260);
        auVar264 = vfmadd213ps_avx512f(auVar260,(undefined1  [64])afVar85,(undefined1  [64])afVar86)
        ;
        auVar264 = vfmadd213ps_avx512f(auVar264,auVar260,(undefined1  [64])afVar87);
        auVar264 = vfmadd213ps_avx512f(auVar264,auVar260,(undefined1  [64])afVar88);
        auVar264 = vfmadd213ps_avx512f(auVar264,auVar260,(undefined1  [64])afVar89);
        auVar264 = vfmadd213ps_avx512f(auVar264,auVar260,(undefined1  [64])afVar90);
        in_ZMM19 = vfmadd213ps_avx512f(auVar264,auVar262,auVar260);
        auVar260 = vaddps_avx512f(in_ZMM19,(undefined1  [64])afVar81);
        auVar262 = vcvttps2dq_avx512f(in_ZMM18);
        auVar262 = vpaddd_avx512f(auVar262,auVar222);
        auVar262 = vpslld_avx512f(auVar262,0x17);
        in_ZMM17 = vfmadd213ps_avx512f(auVar262,auVar260,auVar242);
        in_ZMM16 = vdivps_avx512f(auVar242,in_ZMM17);
        break;
      case 5:
        auVar262 = vminps_avx512f(auVar260,(undefined1  [64])afVar82);
        auVar262 = vmaxps_avx512f(auVar262,(undefined1  [64])afVar83);
        auVar264 = vfmadd213ps_avx512f((undefined1  [64])afVar84,auVar262,(undefined1  [64])afVar90)
        ;
        auVar265 = vrndscaleps_avx512f(auVar264,1);
        uVar16 = vcmpps_avx512f(auVar264,auVar265,1);
        auVar263 = vsubps_avx512f(auVar265,(undefined1  [64])afVar81);
        bVar14 = (bool)((byte)uVar16 & 1);
        auVar264._0_4_ = (uint)bVar14 * auVar263._0_4_ | (uint)!bVar14 * auVar265._0_4_;
        bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar264._4_4_ = (uint)bVar14 * auVar263._4_4_ | (uint)!bVar14 * auVar265._4_4_;
        bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar264._8_4_ = (uint)bVar14 * auVar263._8_4_ | (uint)!bVar14 * auVar265._8_4_;
        bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar264._12_4_ = (uint)bVar14 * auVar263._12_4_ | (uint)!bVar14 * auVar265._12_4_;
        bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar264._16_4_ = (uint)bVar14 * auVar263._16_4_ | (uint)!bVar14 * auVar265._16_4_;
        bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar264._20_4_ = (uint)bVar14 * auVar263._20_4_ | (uint)!bVar14 * auVar265._20_4_;
        bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar264._24_4_ = (uint)bVar14 * auVar263._24_4_ | (uint)!bVar14 * auVar265._24_4_;
        bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
        auVar264._28_4_ = (uint)bVar14 * auVar263._28_4_ | (uint)!bVar14 * auVar265._28_4_;
        bVar14 = (bool)((byte)(uVar16 >> 8) & 1);
        auVar264._32_4_ = (uint)bVar14 * auVar263._32_4_ | (uint)!bVar14 * auVar265._32_4_;
        bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
        auVar264._36_4_ = (uint)bVar14 * auVar263._36_4_ | (uint)!bVar14 * auVar265._36_4_;
        bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
        auVar264._40_4_ = (uint)bVar14 * auVar263._40_4_ | (uint)!bVar14 * auVar265._40_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
        auVar264._44_4_ = (uint)bVar14 * auVar263._44_4_ | (uint)!bVar14 * auVar265._44_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
        auVar264._48_4_ = (uint)bVar14 * auVar263._48_4_ | (uint)!bVar14 * auVar265._48_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
        auVar264._52_4_ = (uint)bVar14 * auVar263._52_4_ | (uint)!bVar14 * auVar265._52_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
        auVar264._56_4_ = (uint)bVar14 * auVar263._56_4_ | (uint)!bVar14 * auVar265._56_4_;
        bVar14 = SUB81(uVar16 >> 0xf,0);
        auVar264._60_4_ = (uint)bVar14 * auVar263._60_4_ | (uint)!bVar14 * auVar265._60_4_;
        auVar262 = vfmadd231ps_avx512f(auVar262,auVar264,auVar261);
        auVar262 = vfmadd231ps_avx512f(auVar262,auVar264,auVar209);
        auVar265 = vmulps_avx512f(auVar262,auVar262);
        auVar263 = vfmadd213ps_avx512f(auVar262,(undefined1  [64])afVar85,(undefined1  [64])afVar86)
        ;
        auVar263 = vfmadd213ps_avx512f(auVar263,auVar262,(undefined1  [64])afVar87);
        auVar263 = vfmadd213ps_avx512f(auVar263,auVar262,(undefined1  [64])afVar88);
        auVar263 = vfmadd213ps_avx512f(auVar263,auVar262,(undefined1  [64])afVar89);
        auVar263 = vfmadd213ps_avx512f(auVar263,auVar262,(undefined1  [64])afVar90);
        auVar262 = vfmadd213ps_avx512f(auVar263,auVar265,auVar262);
        auVar262 = vaddps_avx512f(auVar262,(undefined1  [64])afVar81);
        auVar264 = vcvttps2dq_avx512f(auVar264);
        auVar264 = vpaddd_avx512f(auVar264,auVar222);
        auVar264 = vpslld_avx512f(auVar264,0x17);
        auVar262 = vfmadd213ps_avx512f(auVar264,auVar262,auVar242);
        auVar264 = vmaxps_avx512f(auVar262,(undefined1  [64])_ps512_min_norm_pos);
        auVar265 = vpsrld_avx512f(auVar264,0x17);
        auVar264 = vpternlogd_avx512f(auVar264,(undefined1  [64])afVar90,
                                      (undefined1  [64])_ps512_inv_mant_mask,0xec);
        uVar16 = vcmpps_avx512f(auVar264,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar263 = vsubps_avx512f(auVar264,(undefined1  [64])afVar81);
        auVar264 = vaddps_avx512f(auVar263,auVar264);
        bVar14 = (bool)((byte)uVar16 & 1);
        auVar182._0_4_ = (uint)bVar14 * auVar264._0_4_ | (uint)!bVar14 * auVar263._0_4_;
        bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar182._4_4_ = (uint)bVar14 * auVar264._4_4_ | (uint)!bVar14 * auVar263._4_4_;
        bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar182._8_4_ = (uint)bVar14 * auVar264._8_4_ | (uint)!bVar14 * auVar263._8_4_;
        bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar182._12_4_ = (uint)bVar14 * auVar264._12_4_ | (uint)!bVar14 * auVar263._12_4_;
        bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar182._16_4_ = (uint)bVar14 * auVar264._16_4_ | (uint)!bVar14 * auVar263._16_4_;
        bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar182._20_4_ = (uint)bVar14 * auVar264._20_4_ | (uint)!bVar14 * auVar263._20_4_;
        bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar182._24_4_ = (uint)bVar14 * auVar264._24_4_ | (uint)!bVar14 * auVar263._24_4_;
        bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
        auVar182._28_4_ = (uint)bVar14 * auVar264._28_4_ | (uint)!bVar14 * auVar263._28_4_;
        bVar15 = (byte)(uVar16 >> 8);
        bVar14 = (bool)(bVar15 & 1);
        auVar182._32_4_ = (uint)bVar14 * auVar264._32_4_ | (uint)!bVar14 * auVar263._32_4_;
        bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
        auVar182._36_4_ = (uint)bVar14 * auVar264._36_4_ | (uint)!bVar14 * auVar263._36_4_;
        bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
        auVar182._40_4_ = (uint)bVar14 * auVar264._40_4_ | (uint)!bVar14 * auVar263._40_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
        auVar182._44_4_ = (uint)bVar14 * auVar264._44_4_ | (uint)!bVar14 * auVar263._44_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
        auVar182._48_4_ = (uint)bVar14 * auVar264._48_4_ | (uint)!bVar14 * auVar263._48_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
        auVar182._52_4_ = (uint)bVar14 * auVar264._52_4_ | (uint)!bVar14 * auVar263._52_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
        auVar182._56_4_ = (uint)bVar14 * auVar264._56_4_ | (uint)!bVar14 * auVar263._56_4_;
        bVar14 = SUB81(uVar16 >> 0xf,0);
        auVar182._60_4_ = (uint)bVar14 * auVar264._60_4_ | (uint)!bVar14 * auVar263._60_4_;
        auVar264 = vmulps_avx512f(auVar182,auVar182);
        auVar263 = vfmadd132ps_avx512f(auVar182,(undefined1  [64])_ps512_cephes_log_p1,
                                       (undefined1  [64])_ps512_cephes_log_p0);
        auVar263 = vfmadd213ps_avx512f(auVar263,auVar182,(undefined1  [64])_ps512_cephes_log_p2);
        auVar263 = vfmadd213ps_avx512f(auVar263,auVar182,(undefined1  [64])_ps512_cephes_log_p3);
        auVar263 = vfmadd213ps_avx512f(auVar263,auVar182,(undefined1  [64])_ps512_cephes_log_p4);
        auVar263 = vfmadd213ps_avx512f(auVar263,auVar182,(undefined1  [64])_ps512_cephes_log_p5);
        auVar263 = vfmadd213ps_avx512f(auVar263,auVar182,(undefined1  [64])_ps512_cephes_log_p6);
        auVar263 = vfmadd213ps_avx512f(auVar263,auVar182,(undefined1  [64])_ps512_cephes_log_p7);
        in_ZMM21 = vfmadd213ps_avx512f(auVar263,auVar182,(undefined1  [64])_ps512_cephes_log_p8);
        auVar263 = vmulps_avx512f(auVar264,auVar182);
        auVar263 = vfmadd213ps_avx512f(auVar263,in_ZMM21,auVar182);
        uVar17 = vcmpps_avx512f(auVar262,auVar248,2);
        auVar262 = vpsubd_avx512f(auVar265,auVar222);
        auVar262 = vcvtdq2ps_avx512f(auVar262);
        auVar265 = vaddps_avx512f(auVar262,(undefined1  [64])afVar81);
        bVar14 = (bool)((byte)uVar16 & 1);
        auVar183._0_4_ = (uint)bVar14 * auVar262._0_4_ | (uint)!bVar14 * auVar265._0_4_;
        bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar183._4_4_ = (uint)bVar14 * auVar262._4_4_ | (uint)!bVar14 * auVar265._4_4_;
        bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar183._8_4_ = (uint)bVar14 * auVar262._8_4_ | (uint)!bVar14 * auVar265._8_4_;
        bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar183._12_4_ = (uint)bVar14 * auVar262._12_4_ | (uint)!bVar14 * auVar265._12_4_;
        bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar183._16_4_ = (uint)bVar14 * auVar262._16_4_ | (uint)!bVar14 * auVar265._16_4_;
        bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar183._20_4_ = (uint)bVar14 * auVar262._20_4_ | (uint)!bVar14 * auVar265._20_4_;
        bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar183._24_4_ = (uint)bVar14 * auVar262._24_4_ | (uint)!bVar14 * auVar265._24_4_;
        bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
        auVar183._28_4_ = (uint)bVar14 * auVar262._28_4_ | (uint)!bVar14 * auVar265._28_4_;
        bVar14 = (bool)(bVar15 & 1);
        auVar183._32_4_ = (uint)bVar14 * auVar262._32_4_ | (uint)!bVar14 * auVar265._32_4_;
        bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
        auVar183._36_4_ = (uint)bVar14 * auVar262._36_4_ | (uint)!bVar14 * auVar265._36_4_;
        bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
        auVar183._40_4_ = (uint)bVar14 * auVar262._40_4_ | (uint)!bVar14 * auVar265._40_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
        auVar183._44_4_ = (uint)bVar14 * auVar262._44_4_ | (uint)!bVar14 * auVar265._44_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
        auVar183._48_4_ = (uint)bVar14 * auVar262._48_4_ | (uint)!bVar14 * auVar265._48_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
        auVar183._52_4_ = (uint)bVar14 * auVar262._52_4_ | (uint)!bVar14 * auVar265._52_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
        auVar183._56_4_ = (uint)bVar14 * auVar262._56_4_ | (uint)!bVar14 * auVar265._56_4_;
        bVar14 = SUB81(uVar16 >> 0xf,0);
        auVar183._60_4_ = (uint)bVar14 * auVar262._60_4_ | (uint)!bVar14 * auVar265._60_4_;
        auVar262 = vfmadd231ps_avx512f(auVar263,auVar183,(undefined1  [64])afVar91);
        auVar262 = vfmadd231ps_avx512f(auVar262,auVar233,auVar264);
        in_ZMM22 = vfmadd231ps_avx512f(auVar262,(undefined1  [64])afVar92,auVar183);
        auVar262 = vmulps_avx512f(in_ZMM22,auVar245);
        auVar264 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        bVar14 = (bool)((byte)uVar17 & 1);
        auVar265._0_4_ = (uint)bVar14 * auVar264._0_4_ | (uint)!bVar14 * auVar262._0_4_;
        bVar14 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar265._4_4_ = (uint)bVar14 * auVar264._4_4_ | (uint)!bVar14 * auVar262._4_4_;
        bVar14 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar265._8_4_ = (uint)bVar14 * auVar264._8_4_ | (uint)!bVar14 * auVar262._8_4_;
        bVar14 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar265._12_4_ = (uint)bVar14 * auVar264._12_4_ | (uint)!bVar14 * auVar262._12_4_;
        bVar14 = (bool)((byte)(uVar17 >> 4) & 1);
        auVar265._16_4_ = (uint)bVar14 * auVar264._16_4_ | (uint)!bVar14 * auVar262._16_4_;
        bVar14 = (bool)((byte)(uVar17 >> 5) & 1);
        auVar265._20_4_ = (uint)bVar14 * auVar264._20_4_ | (uint)!bVar14 * auVar262._20_4_;
        bVar14 = (bool)((byte)(uVar17 >> 6) & 1);
        auVar265._24_4_ = (uint)bVar14 * auVar264._24_4_ | (uint)!bVar14 * auVar262._24_4_;
        bVar14 = (bool)((byte)(uVar17 >> 7) & 1);
        auVar265._28_4_ = (uint)bVar14 * auVar264._28_4_ | (uint)!bVar14 * auVar262._28_4_;
        bVar14 = (bool)((byte)(uVar17 >> 8) & 1);
        auVar265._32_4_ = (uint)bVar14 * auVar264._32_4_ | (uint)!bVar14 * auVar262._32_4_;
        bVar14 = (bool)((byte)(uVar17 >> 9) & 1);
        auVar265._36_4_ = (uint)bVar14 * auVar264._36_4_ | (uint)!bVar14 * auVar262._36_4_;
        bVar14 = (bool)((byte)(uVar17 >> 10) & 1);
        auVar265._40_4_ = (uint)bVar14 * auVar264._40_4_ | (uint)!bVar14 * auVar262._40_4_;
        bVar14 = (bool)((byte)(uVar17 >> 0xb) & 1);
        auVar265._44_4_ = (uint)bVar14 * auVar264._44_4_ | (uint)!bVar14 * auVar262._44_4_;
        bVar14 = (bool)((byte)(uVar17 >> 0xc) & 1);
        auVar265._48_4_ = (uint)bVar14 * auVar264._48_4_ | (uint)!bVar14 * auVar262._48_4_;
        bVar14 = (bool)((byte)(uVar17 >> 0xd) & 1);
        auVar265._52_4_ = (uint)bVar14 * auVar264._52_4_ | (uint)!bVar14 * auVar262._52_4_;
        bVar14 = (bool)((byte)(uVar17 >> 0xe) & 1);
        auVar265._56_4_ = (uint)bVar14 * auVar264._56_4_ | (uint)!bVar14 * auVar262._56_4_;
        bVar14 = SUB81(uVar17 >> 0xf,0);
        auVar265._60_4_ = (uint)bVar14 * auVar264._60_4_ | (uint)!bVar14 * auVar262._60_4_;
        auVar262 = vminps_avx512f(auVar265,(undefined1  [64])afVar82);
        auVar262 = vmaxps_avx512f(auVar262,(undefined1  [64])afVar83);
        auVar264 = vfmadd213ps_avx512f((undefined1  [64])afVar84,auVar262,(undefined1  [64])afVar90)
        ;
        auVar265 = vrndscaleps_avx512f(auVar264,1);
        uVar16 = vcmpps_avx512f(auVar264,auVar265,1);
        auVar264 = vsubps_avx512f(auVar265,(undefined1  [64])afVar81);
        bVar14 = (bool)((byte)uVar16 & 1);
        in_ZMM19._0_4_ = (uint)bVar14 * auVar264._0_4_ | (uint)!bVar14 * auVar265._0_4_;
        bVar14 = (bool)((byte)(uVar16 >> 1) & 1);
        in_ZMM19._4_4_ = (uint)bVar14 * auVar264._4_4_ | (uint)!bVar14 * auVar265._4_4_;
        bVar14 = (bool)((byte)(uVar16 >> 2) & 1);
        in_ZMM19._8_4_ = (uint)bVar14 * auVar264._8_4_ | (uint)!bVar14 * auVar265._8_4_;
        bVar14 = (bool)((byte)(uVar16 >> 3) & 1);
        in_ZMM19._12_4_ = (uint)bVar14 * auVar264._12_4_ | (uint)!bVar14 * auVar265._12_4_;
        bVar14 = (bool)((byte)(uVar16 >> 4) & 1);
        in_ZMM19._16_4_ = (uint)bVar14 * auVar264._16_4_ | (uint)!bVar14 * auVar265._16_4_;
        bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
        in_ZMM19._20_4_ = (uint)bVar14 * auVar264._20_4_ | (uint)!bVar14 * auVar265._20_4_;
        bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
        in_ZMM19._24_4_ = (uint)bVar14 * auVar264._24_4_ | (uint)!bVar14 * auVar265._24_4_;
        bVar14 = (bool)((byte)(uVar16 >> 7) & 1);
        in_ZMM19._28_4_ = (uint)bVar14 * auVar264._28_4_ | (uint)!bVar14 * auVar265._28_4_;
        bVar14 = (bool)((byte)(uVar16 >> 8) & 1);
        in_ZMM19._32_4_ = (uint)bVar14 * auVar264._32_4_ | (uint)!bVar14 * auVar265._32_4_;
        bVar14 = (bool)((byte)(uVar16 >> 9) & 1);
        in_ZMM19._36_4_ = (uint)bVar14 * auVar264._36_4_ | (uint)!bVar14 * auVar265._36_4_;
        bVar14 = (bool)((byte)(uVar16 >> 10) & 1);
        in_ZMM19._40_4_ = (uint)bVar14 * auVar264._40_4_ | (uint)!bVar14 * auVar265._40_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xb) & 1);
        in_ZMM19._44_4_ = (uint)bVar14 * auVar264._44_4_ | (uint)!bVar14 * auVar265._44_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xc) & 1);
        in_ZMM19._48_4_ = (uint)bVar14 * auVar264._48_4_ | (uint)!bVar14 * auVar265._48_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xd) & 1);
        in_ZMM19._52_4_ = (uint)bVar14 * auVar264._52_4_ | (uint)!bVar14 * auVar265._52_4_;
        bVar14 = (bool)((byte)(uVar16 >> 0xe) & 1);
        in_ZMM19._56_4_ = (uint)bVar14 * auVar264._56_4_ | (uint)!bVar14 * auVar265._56_4_;
        bVar14 = SUB81(uVar16 >> 0xf,0);
        in_ZMM19._60_4_ = (uint)bVar14 * auVar264._60_4_ | (uint)!bVar14 * auVar265._60_4_;
        auVar262 = vfmadd231ps_avx512f(auVar262,in_ZMM19,auVar261);
        auVar262 = vfmadd231ps_avx512f(auVar262,in_ZMM19,auVar209);
        auVar264 = vmulps_avx512f(auVar262,auVar262);
        auVar265 = vfmadd213ps_avx512f(auVar262,(undefined1  [64])afVar85,(undefined1  [64])afVar86)
        ;
        auVar265 = vfmadd213ps_avx512f(auVar265,auVar262,(undefined1  [64])afVar87);
        auVar265 = vfmadd213ps_avx512f(auVar265,auVar262,(undefined1  [64])afVar88);
        auVar265 = vfmadd213ps_avx512f(auVar265,auVar262,(undefined1  [64])afVar89);
        auVar265 = vfmadd213ps_avx512f(auVar265,auVar262,(undefined1  [64])afVar90);
        in_ZMM20 = vfmadd213ps_avx512f(auVar265,auVar264,auVar262);
        auVar262 = vaddps_avx512f(in_ZMM20,(undefined1  [64])afVar81);
        auVar264 = vcvttps2dq_avx512f(in_ZMM19);
        auVar264 = vpaddd_avx512f(auVar264,auVar222);
        auVar264 = vpslld_avx512f(auVar264,0x17);
        in_ZMM18 = vfmadd213ps_avx512f(auVar264,auVar262,auVar242);
        auVar262 = vdivps_avx512f(auVar242,in_ZMM18);
        in_ZMM17 = vfnmsub213ps_avx512f(auVar262,auVar245,auVar242);
        goto LAB_002b7954;
      case 6:
        puVar11 = (uint *)(this->super_InnerProduct).activation_params.data;
        auVar264 = vbroadcastss_avx512f(ZEXT416(*puVar11));
        uVar103 = puVar11[1];
        auVar262._4_4_ = uVar103;
        auVar262._0_4_ = uVar103;
        auVar262._8_4_ = uVar103;
        auVar262._12_4_ = uVar103;
        auVar262._16_4_ = uVar103;
        auVar262._20_4_ = uVar103;
        auVar262._24_4_ = uVar103;
        auVar262._28_4_ = uVar103;
        auVar262._32_4_ = uVar103;
        auVar262._36_4_ = uVar103;
        auVar262._40_4_ = uVar103;
        auVar262._44_4_ = uVar103;
        auVar262._48_4_ = uVar103;
        auVar262._52_4_ = uVar103;
        auVar262._56_4_ = uVar103;
        auVar262._60_4_ = uVar103;
        auVar262 = vfmadd213ps_avx512f(auVar264,auVar260,auVar262);
        auVar262 = vmaxps_avx512f(auVar262,auVar248);
        in_ZMM17 = vminps_avx512f(auVar262,auVar242);
LAB_002b7954:
        in_ZMM16 = vmulps_avx512f(in_ZMM17,auVar260);
      }
      *(undefined1 (*) [64])((long)top_blob->data + uVar97 * 0x40) = in_ZMM16;
      uVar97 = uVar97 + 1;
    } while (uVar97 != uVar96);
  }
  iVar93 = 0;
LAB_002b8f8b:
  if (piStack_120 != (int *)0x0) {
    LOCK();
    *piStack_120 = *piStack_120 + -1;
    UNLOCK();
    if (*piStack_120 == 0) {
      if (local_108 == (Allocator *)0x0) {
        if (local_128 != (undefined1 (*) [32])0x0) {
          free(local_128);
        }
      }
      else {
        (*local_108->_vptr_Allocator[3])();
      }
    }
  }
  return iVar93;
}

Assistant:

int InnerProduct_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}